

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O1

void av1_warp_affine_sse4_1
               (int32_t *mat,uint8_t *ref,int width,int height,int stride,uint8_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,int16_t delta)

{
  int iVar1;
  int8_t aiVar2 [8];
  int8_t aiVar3 [8];
  int8_t aiVar4 [8];
  ulong uVar5;
  WarpedFilterCoeff aWVar6 [8];
  WarpedFilterCoeff aWVar7 [8];
  WarpedFilterCoeff aWVar8 [8];
  long lVar9;
  undefined1 auVar10 [12];
  byte bVar11;
  int iVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  byte bVar39;
  int iVar40;
  uint uVar41;
  long lVar42;
  long lVar43;
  byte bVar44;
  uint uVar45;
  int iVar46;
  uint uVar47;
  long lVar48;
  int iVar49;
  uint uVar50;
  undefined4 *puVar51;
  uint uVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  long lVar56;
  long lVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  uint uVar61;
  undefined1 (*pauVar62) [16];
  int iVar63;
  long lVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  long lVar68;
  int iVar69;
  uint uVar70;
  int iVar71;
  long lVar72;
  int iVar73;
  undefined4 uVar74;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined4 uVar75;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined4 uVar76;
  undefined1 auVar95 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  short sVar147;
  short sVar151;
  short sVar152;
  short sVar153;
  short sVar154;
  short sVar155;
  short sVar156;
  short sVar157;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar158 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar199 [16];
  int iVar235;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar206 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar230 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined4 uVar236;
  undefined1 in_XMM4 [16];
  undefined1 auVar238 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar259 [16];
  undefined1 auVar262 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar264 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar272 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  int iVar319;
  int iVar320;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  int iVar321;
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  int iVar344;
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  int iVar345;
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar346 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  __m128i tmp [15];
  int local_318;
  int local_2fc;
  short local_2e8;
  short sStack_2e6;
  WarpedFilterCoeff WStack_2e4;
  WarpedFilterCoeff WStack_2e2;
  undefined2 uStack_2e0;
  undefined2 uStack_2de;
  undefined2 uStack_2dc;
  undefined2 uStack_2da;
  short local_178;
  short sStack_176;
  undefined4 local_168 [4];
  undefined2 auStack_158 [8];
  undefined1 auStack_148 [16];
  undefined2 auStack_138 [8];
  undefined1 auStack_128 [16];
  undefined2 auStack_118 [8];
  undefined1 auStack_108 [16];
  undefined2 auStack_f8 [64];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar96 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar110 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar97 [16];
  undefined1 auVar111 [16];
  undefined1 auVar98 [16];
  undefined1 auVar112 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar179 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar229 [16];
  undefined1 auVar191 [16];
  undefined1 auVar196 [16];
  undefined1 auVar203 [16];
  undefined1 auVar207 [16];
  undefined1 auVar214 [16];
  undefined1 auVar222 [16];
  undefined1 auVar192 [16];
  undefined1 auVar197 [16];
  undefined1 auVar204 [16];
  undefined1 auVar208 [16];
  undefined1 auVar215 [16];
  undefined1 auVar223 [16];
  undefined1 auVar193 [16];
  undefined1 auVar198 [16];
  undefined1 auVar205 [16];
  undefined1 auVar209 [16];
  undefined1 auVar216 [16];
  undefined1 auVar224 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar237 [16];
  undefined1 auVar258 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar263 [16];
  undefined1 auVar271 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar347 [16];
  undefined1 auVar352 [16];
  undefined1 auVar348 [16];
  undefined1 auVar353 [16];
  undefined1 auVar349 [16];
  undefined1 auVar354 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  
  uVar47 = conv_params->round_0;
  if (conv_params->is_compound == 0) {
    uVar50 = 0xe - uVar47;
  }
  else {
    uVar50 = conv_params->round_1;
  }
  bVar39 = (byte)uVar47;
  bVar44 = 0x16 - bVar39;
  if (conv_params->is_compound == 1) {
    iVar53 = 1 << (bVar44 & 0x1f);
  }
  else {
    iVar53 = -1 << ((byte)uVar50 + 7 & 0x1f);
  }
  iVar53 = ((1 << ((byte)uVar50 & 0x1f)) >> 1) + iVar53;
  if (0 < p_height) {
    uVar61 = 0xe - (conv_params->round_1 + uVar47);
    iVar66 = (int)alpha;
    iVar73 = (int)beta;
    iVar69 = (int)gamma;
    iVar40 = (int)delta;
    iVar54 = 1 << (0xe - bVar39 & 0x1f);
    auVar322 = ZEXT416(uVar47);
    iVar63 = iVar73 * -3 + 0x10200;
    auVar77._4_4_ = iVar53;
    auVar77._0_4_ = iVar53;
    auVar77._8_4_ = iVar53;
    auVar77._12_4_ = iVar53;
    auVar78 = pshuflw(auVar77,ZEXT416(((uint)(1 << (bVar39 & 0x1f)) >> 1) + 0x4000),0);
    uVar74 = auVar78._0_4_;
    auVar84._4_4_ = uVar74;
    auVar84._0_4_ = uVar74;
    auVar84._8_4_ = uVar74;
    auVar84._12_4_ = uVar74;
    iVar1 = height + -1;
    lVar64 = (long)height;
    uVar41 = (uint)(1 << ((byte)uVar61 & 0x1f)) >> 1;
    iVar12 = iVar66 * 2;
    local_2fc = 0;
    iVar49 = 0;
    local_68 = auVar322;
    local_78 = auVar84;
    auVar301 = _DAT_00562b70;
    auVar333 = _DAT_00562b80;
    uVar47 = p_height;
    do {
      uVar45 = 8;
      if ((int)uVar47 < 8) {
        uVar45 = uVar47;
      }
      if ((int)uVar45 < 2) {
        uVar45 = 1;
      }
      lVar48 = (long)(int)uVar47;
      if (7 < lVar48) {
        lVar48 = 8;
      }
      if (lVar48 < -5) {
        lVar48 = -6;
      }
      if (0 < p_width) {
        lVar9 = (ulong)uVar45 << 4;
        lVar48 = lVar48 + 7;
        iVar55 = p_height - iVar49;
        iVar65 = 8;
        if (iVar55 < 8) {
          iVar65 = iVar55;
        }
        lVar42 = (long)(p_row + 4 + iVar49 << ((byte)subsampling_y & 0x1f));
        lVar43 = (long)iVar65;
        iVar65 = 0;
        local_318 = local_2fc;
        do {
          lVar56 = (long)(p_col + 4 + iVar65 << ((byte)subsampling_x & 0x1f));
          lVar72 = (long)*mat + mat[3] * lVar42 + mat[2] * lVar56 >> ((byte)subsampling_x & 0x3f);
          lVar56 = (long)mat[1] + mat[5] * lVar42 + mat[4] * lVar56 >> ((byte)subsampling_y & 0x3f);
          uVar45 = (uint)((ulong)lVar72 >> 0x10);
          iVar71 = (int)((ulong)lVar56 >> 0x10);
          if ((int)uVar45 < -6) {
            if (-7 < iVar55) {
              lVar72 = -7;
              puVar51 = local_168;
              do {
                iVar67 = iVar71 + (int)lVar72;
                if (lVar64 <= iVar71 + lVar72) {
                  iVar67 = iVar1;
                }
                if (iVar71 + lVar72 < 0) {
                  iVar67 = 0;
                }
                auVar78 = ZEXT416(((uint)ref[iVar67 * stride] << (7 - bVar39 & 0x1f)) + iVar54);
                auVar78 = pshuflw(auVar78,auVar78,0);
                uVar74 = auVar78._0_4_;
                *puVar51 = uVar74;
                puVar51[1] = uVar74;
                puVar51[2] = uVar74;
                puVar51[3] = uVar74;
                lVar72 = lVar72 + 1;
                puVar51 = puVar51 + 4;
              } while (lVar72 < lVar43);
            }
          }
          else if ((int)uVar45 < width + 6) {
            uVar70 = ((uint)lVar72 & 0xfffc) + (iVar73 + iVar66) * -4 & 0xffffffc0;
            sVar147 = auVar84._0_2_;
            sVar151 = auVar84._2_2_;
            sVar152 = auVar84._4_2_;
            sVar153 = auVar84._6_2_;
            sVar154 = auVar84._8_2_;
            sVar155 = auVar84._10_2_;
            sVar156 = auVar84._12_2_;
            sVar157 = auVar84._14_2_;
            lVar72 = auVar322._0_8_;
            if (width < (int)(uVar45 + 9) || (int)uVar45 < 7) {
              if (-7 < iVar55) {
                uVar52 = (uVar45 - width) + 8;
                iVar67 = uVar70 + iVar63;
                lVar68 = -7;
                pauVar62 = (undefined1 (*) [16])local_168;
                do {
                  iVar46 = iVar71 + (int)lVar68;
                  if (lVar64 <= iVar71 + lVar68) {
                    iVar46 = iVar1;
                  }
                  if (iVar71 + lVar68 < 0) {
                    iVar46 = 0;
                  }
                  auVar78 = *(undefined1 (*) [16])
                             (ref + (long)(iVar46 * stride) + (long)(int)uVar45 + -7);
                  if ((int)uVar45 < 7) {
                    auVar78 = pshufb(auVar78,(undefined1  [16])warp_pad_left[6 - uVar45]);
                  }
                  if (-1 < (int)uVar52) {
                    auVar78 = pshufb(auVar78,(undefined1  [16])warp_pad_right[uVar52]);
                  }
                  aiVar2 = av1_filter_8bit[iVar67 >> 10];
                  aiVar3 = av1_filter_8bit[iVar66 + iVar67 >> 10];
                  iVar58 = iVar66 + iVar12 + iVar67;
                  aiVar4 = av1_filter_8bit[iVar12 + iVar67 >> 10];
                  auVar240._8_4_ = 0;
                  auVar240[0] = aiVar2[0];
                  auVar240[1] = aiVar2[1];
                  auVar240[2] = aiVar2[2];
                  auVar240[3] = aiVar2[3];
                  auVar240[4] = aiVar2[4];
                  auVar240[5] = aiVar2[5];
                  auVar240[6] = aiVar2[6];
                  auVar240[7] = aiVar2[7];
                  auVar240._12_2_ = aiVar2._6_2_;
                  auVar240._14_2_ = aiVar4._6_2_;
                  auVar239._12_4_ = auVar240._12_4_;
                  auVar239._8_2_ = 0;
                  auVar239[0] = aiVar2[0];
                  auVar239[1] = aiVar2[1];
                  auVar239[2] = aiVar2[2];
                  auVar239[3] = aiVar2[3];
                  auVar239[4] = aiVar2[4];
                  auVar239[5] = aiVar2[5];
                  auVar239[6] = aiVar2[6];
                  auVar239[7] = aiVar2[7];
                  auVar239._10_2_ = aiVar4._4_2_;
                  auVar238._10_6_ = auVar239._10_6_;
                  auVar238._8_2_ = aiVar2._4_2_;
                  auVar238[0] = aiVar2[0];
                  auVar238[1] = aiVar2[1];
                  auVar238[2] = aiVar2[2];
                  auVar238[3] = aiVar2[3];
                  auVar238[4] = aiVar2[4];
                  auVar238[5] = aiVar2[5];
                  auVar238[6] = aiVar2[6];
                  auVar238[7] = aiVar2[7];
                  auVar27._4_8_ = auVar238._8_8_;
                  auVar27._2_2_ = aiVar4._2_2_;
                  auVar27._0_2_ = aiVar2._2_2_;
                  auVar237._0_4_ = CONCAT22(aiVar4._0_2_,aiVar2._0_2_);
                  auVar237._4_12_ = auVar27;
                  iVar46 = iVar66 + iVar58;
                  aiVar2 = av1_filter_8bit[iVar58 >> 10];
                  auVar266._8_4_ = 0;
                  auVar266[0] = aiVar3[0];
                  auVar266[1] = aiVar3[1];
                  auVar266[2] = aiVar3[2];
                  auVar266[3] = aiVar3[3];
                  auVar266[4] = aiVar3[4];
                  auVar266[5] = aiVar3[5];
                  auVar266[6] = aiVar3[6];
                  auVar266[7] = aiVar3[7];
                  auVar266._12_2_ = aiVar3._6_2_;
                  auVar266._14_2_ = aiVar2._6_2_;
                  auVar265._12_4_ = auVar266._12_4_;
                  auVar265._8_2_ = 0;
                  auVar265[0] = aiVar3[0];
                  auVar265[1] = aiVar3[1];
                  auVar265[2] = aiVar3[2];
                  auVar265[3] = aiVar3[3];
                  auVar265[4] = aiVar3[4];
                  auVar265[5] = aiVar3[5];
                  auVar265[6] = aiVar3[6];
                  auVar265[7] = aiVar3[7];
                  auVar265._10_2_ = aiVar2._4_2_;
                  auVar264._10_6_ = auVar265._10_6_;
                  auVar264._8_2_ = aiVar3._4_2_;
                  auVar264[0] = aiVar3[0];
                  auVar264[1] = aiVar3[1];
                  auVar264[2] = aiVar3[2];
                  auVar264[3] = aiVar3[3];
                  auVar264[4] = aiVar3[4];
                  auVar264[5] = aiVar3[5];
                  auVar264[6] = aiVar3[6];
                  auVar264[7] = aiVar3[7];
                  auVar28._4_8_ = auVar264._8_8_;
                  auVar28._2_2_ = aiVar2._2_2_;
                  auVar28._0_2_ = aiVar3._2_2_;
                  auVar263._0_4_ = CONCAT22(aiVar2._0_2_,aiVar3._0_2_);
                  auVar263._4_12_ = auVar28;
                  iVar58 = iVar66 + iVar46;
                  aiVar2 = av1_filter_8bit[iVar46 >> 10];
                  iVar46 = iVar66 + iVar58;
                  aiVar3 = av1_filter_8bit[iVar58 >> 10];
                  aiVar4 = av1_filter_8bit[iVar46 >> 10];
                  auVar81._8_4_ = 0;
                  auVar81[0] = aiVar2[0];
                  auVar81[1] = aiVar2[1];
                  auVar81[2] = aiVar2[2];
                  auVar81[3] = aiVar2[3];
                  auVar81[4] = aiVar2[4];
                  auVar81[5] = aiVar2[5];
                  auVar81[6] = aiVar2[6];
                  auVar81[7] = aiVar2[7];
                  auVar81._12_2_ = aiVar2._6_2_;
                  auVar81._14_2_ = aiVar4._6_2_;
                  auVar80._12_4_ = auVar81._12_4_;
                  auVar80._8_2_ = 0;
                  auVar80[0] = aiVar2[0];
                  auVar80[1] = aiVar2[1];
                  auVar80[2] = aiVar2[2];
                  auVar80[3] = aiVar2[3];
                  auVar80[4] = aiVar2[4];
                  auVar80[5] = aiVar2[5];
                  auVar80[6] = aiVar2[6];
                  auVar80[7] = aiVar2[7];
                  auVar80._10_2_ = aiVar4._4_2_;
                  auVar79._10_6_ = auVar80._10_6_;
                  auVar79._8_2_ = aiVar2._4_2_;
                  auVar79[0] = aiVar2[0];
                  auVar79[1] = aiVar2[1];
                  auVar79[2] = aiVar2[2];
                  auVar79[3] = aiVar2[3];
                  auVar79[4] = aiVar2[4];
                  auVar79[5] = aiVar2[5];
                  auVar79[6] = aiVar2[6];
                  auVar79[7] = aiVar2[7];
                  auVar29._4_8_ = auVar79._8_8_;
                  auVar29._2_2_ = aiVar4._2_2_;
                  auVar29._0_2_ = aiVar2._2_2_;
                  auVar161._6_2_ = aiVar4._0_2_;
                  auVar161._4_2_ = aiVar2._0_2_;
                  aiVar2 = av1_filter_8bit[iVar66 + iVar46 >> 10];
                  auVar160._8_4_ = 0;
                  auVar160[0] = aiVar3[0];
                  auVar160[1] = aiVar3[1];
                  auVar160[2] = aiVar3[2];
                  auVar160[3] = aiVar3[3];
                  auVar160[4] = aiVar3[4];
                  auVar160[5] = aiVar3[5];
                  auVar160[6] = aiVar3[6];
                  auVar160[7] = aiVar3[7];
                  auVar160._12_2_ = aiVar3._6_2_;
                  auVar160._14_2_ = aiVar2._6_2_;
                  auVar159._12_4_ = auVar160._12_4_;
                  auVar159._8_2_ = 0;
                  auVar159[0] = aiVar3[0];
                  auVar159[1] = aiVar3[1];
                  auVar159[2] = aiVar3[2];
                  auVar159[3] = aiVar3[3];
                  auVar159[4] = aiVar3[4];
                  auVar159[5] = aiVar3[5];
                  auVar159[6] = aiVar3[6];
                  auVar159[7] = aiVar3[7];
                  auVar159._10_2_ = aiVar2._4_2_;
                  auVar158._10_6_ = auVar159._10_6_;
                  auVar158._8_2_ = aiVar3._4_2_;
                  auVar158[0] = aiVar3[0];
                  auVar158[1] = aiVar3[1];
                  auVar158[2] = aiVar3[2];
                  auVar158[3] = aiVar3[3];
                  auVar158[4] = aiVar3[4];
                  auVar158[5] = aiVar3[5];
                  auVar158[6] = aiVar3[6];
                  auVar158[7] = aiVar3[7];
                  auVar30._4_8_ = auVar158._8_8_;
                  auVar30._2_2_ = aiVar2._2_2_;
                  auVar30._0_2_ = aiVar3._2_2_;
                  auVar161._14_2_ = aiVar2._0_2_;
                  auVar161._12_2_ = aiVar3._0_2_;
                  auVar276._0_8_ = auVar237._0_8_;
                  auVar276._8_4_ = auVar27._0_4_;
                  auVar276._12_4_ = auVar29._0_4_;
                  auVar161._0_4_ = auVar237._0_4_;
                  auVar241._0_8_ = CONCAT44(auVar79._8_4_,auVar238._8_4_);
                  auVar241._8_4_ = auVar239._12_4_;
                  auVar241._12_4_ = auVar80._12_4_;
                  auVar82._0_8_ = auVar263._0_8_;
                  auVar82._8_4_ = auVar28._0_4_;
                  auVar82._12_4_ = auVar30._0_4_;
                  auVar161._8_4_ = auVar263._0_4_;
                  auVar267._0_8_ = CONCAT44(auVar158._8_4_,auVar264._8_4_);
                  auVar267._8_4_ = auVar265._12_4_;
                  auVar267._12_4_ = auVar159._12_4_;
                  auVar277._8_8_ = auVar82._8_8_;
                  auVar277._0_8_ = auVar276._8_8_;
                  auVar83._8_8_ = auVar267._0_8_;
                  auVar83._0_8_ = auVar241._0_8_;
                  in_XMM4._8_8_ = auVar267._8_8_;
                  in_XMM4._0_8_ = auVar241._8_8_;
                  auVar84 = pshufb(auVar78,auVar301);
                  auVar78 = pshufb(auVar78,auVar333);
                  auVar189._0_8_ = auVar78._0_8_;
                  auVar284._0_8_ = auVar84._0_8_;
                  auVar284._8_8_ = auVar189._0_8_;
                  auVar322 = pmaddubsw(auVar284,auVar161);
                  auVar299._0_8_ = auVar84._4_8_;
                  auVar299._8_4_ = auVar78._4_4_;
                  auVar299._12_4_ = auVar78._8_4_;
                  auVar340 = pmaddubsw(auVar299,auVar277);
                  auVar189._8_8_ = auVar84._2_8_;
                  in_XMM3 = pmaddubsw(auVar189,auVar83);
                  in_XMM5 = auVar84 >> 0x30;
                  auVar162._0_8_ = auVar78._4_8_;
                  auVar162._8_8_ = auVar84._6_8_;
                  auVar78 = pmaddubsw(auVar162,in_XMM4);
                  auVar285._0_2_ =
                       (ushort)(auVar322._0_2_ + sVar147 + auVar340._0_2_ +
                               auVar78._0_2_ + in_XMM3._0_2_) >> lVar72;
                  auVar285._2_2_ =
                       (ushort)(auVar322._2_2_ + sVar151 + auVar340._2_2_ +
                               auVar78._2_2_ + in_XMM3._2_2_) >> lVar72;
                  auVar285._4_2_ =
                       (ushort)(auVar322._4_2_ + sVar152 + auVar340._4_2_ +
                               auVar78._4_2_ + in_XMM3._4_2_) >> lVar72;
                  auVar285._6_2_ =
                       (ushort)(auVar322._6_2_ + sVar153 + auVar340._6_2_ +
                               auVar78._6_2_ + in_XMM3._6_2_) >> lVar72;
                  auVar285._8_2_ =
                       (ushort)(auVar322._8_2_ + sVar154 + auVar340._8_2_ +
                               auVar78._8_2_ + in_XMM3._8_2_) >> lVar72;
                  auVar285._10_2_ =
                       (ushort)(auVar322._10_2_ + sVar155 + auVar340._10_2_ +
                               auVar78._10_2_ + in_XMM3._10_2_) >> lVar72;
                  auVar285._12_2_ =
                       (ushort)(auVar322._12_2_ + sVar156 + auVar340._12_2_ +
                               auVar78._12_2_ + in_XMM3._12_2_) >> lVar72;
                  auVar285._14_2_ =
                       (ushort)(auVar322._14_2_ + sVar157 + auVar340._14_2_ +
                               auVar78._14_2_ + in_XMM3._14_2_) >> lVar72;
                  *pauVar62 = auVar285;
                  lVar68 = lVar68 + 1;
                  iVar67 = iVar67 + iVar73;
                  pauVar62 = pauVar62 + 1;
                } while (lVar68 < lVar43);
              }
            }
            else {
              uVar52 = uVar70 + 0x10200;
              if (beta == 0 && alpha == 0) {
                if (-7 < iVar55) {
                  auVar322._8_8_ = 0;
                  auVar322._0_8_ = av1_filter_8bit[uVar52 >> 10];
                  auVar78 = pshuflw(auVar78,auVar322,0);
                  uVar74 = auVar78._0_4_;
                  in_XMM4._4_4_ = uVar74;
                  in_XMM4._0_4_ = uVar74;
                  in_XMM4._8_4_ = uVar74;
                  in_XMM4._12_4_ = uVar74;
                  auVar78 = pshuflw(auVar78,auVar322,0x55);
                  uVar74 = auVar78._0_4_;
                  in_XMM5._4_4_ = uVar74;
                  in_XMM5._0_4_ = uVar74;
                  in_XMM5._8_4_ = uVar74;
                  in_XMM5._12_4_ = uVar74;
                  auVar78 = pshuflw(auVar78,auVar322,0xaa);
                  uVar74 = auVar78._0_4_;
                  auVar340._4_4_ = uVar74;
                  auVar340._0_4_ = uVar74;
                  auVar340._8_4_ = uVar74;
                  auVar340._12_4_ = uVar74;
                  in_XMM3 = pshufb(auVar322,_DAT_00562b90);
                  lVar57 = (long)iVar71 + -7;
                  pauVar62 = (undefined1 (*) [16])local_168;
                  lVar68 = lVar48;
                  do {
                    iVar71 = iVar1;
                    if (lVar57 < lVar64) {
                      iVar71 = (int)lVar57;
                    }
                    if (lVar57 < 0) {
                      iVar71 = 0;
                    }
                    auVar322 = pshufb(*(undefined1 (*) [16])
                                       (ref + (long)(iVar71 * stride) +
                                              ((ulong)(uVar45 & 0x7fffffff) - 7)),auVar301);
                    auVar78 = pshufb(*(undefined1 (*) [16])
                                      (ref + (long)(iVar71 * stride) +
                                             ((ulong)(uVar45 & 0x7fffffff) - 7)),auVar333);
                    auVar318._0_8_ = auVar78._0_8_;
                    auVar194._0_8_ = auVar322._0_8_;
                    auVar194._8_8_ = auVar318._0_8_;
                    auVar194 = pmaddubsw(auVar194,in_XMM4);
                    auVar350._0_8_ = auVar322._4_8_;
                    auVar350._8_4_ = auVar78._4_4_;
                    auVar350._12_4_ = auVar78._8_4_;
                    auVar350 = pmaddubsw(auVar350,in_XMM5);
                    auVar318._8_8_ = auVar322._2_8_;
                    auVar84 = pmaddubsw(auVar318,auVar340);
                    auVar290._0_8_ = auVar78._4_8_;
                    auVar290._8_8_ = auVar322._6_8_;
                    auVar78 = pmaddubsw(auVar290,in_XMM3);
                    auVar199._0_2_ =
                         (ushort)(auVar194._0_2_ + sVar147 + auVar350._0_2_ +
                                 auVar78._0_2_ + auVar84._0_2_) >> lVar72;
                    auVar199._2_2_ =
                         (ushort)(auVar194._2_2_ + sVar151 + auVar350._2_2_ +
                                 auVar78._2_2_ + auVar84._2_2_) >> lVar72;
                    auVar199._4_2_ =
                         (ushort)(auVar194._4_2_ + sVar152 + auVar350._4_2_ +
                                 auVar78._4_2_ + auVar84._4_2_) >> lVar72;
                    auVar199._6_2_ =
                         (ushort)(auVar194._6_2_ + sVar153 + auVar350._6_2_ +
                                 auVar78._6_2_ + auVar84._6_2_) >> lVar72;
                    auVar199._8_2_ =
                         (ushort)(auVar194._8_2_ + sVar154 + auVar350._8_2_ +
                                 auVar78._8_2_ + auVar84._8_2_) >> lVar72;
                    auVar199._10_2_ =
                         (ushort)(auVar194._10_2_ + sVar155 + auVar350._10_2_ +
                                 auVar78._10_2_ + auVar84._10_2_) >> lVar72;
                    auVar199._12_2_ =
                         (ushort)(auVar194._12_2_ + sVar156 + auVar350._12_2_ +
                                 auVar78._12_2_ + auVar84._12_2_) >> lVar72;
                    auVar199._14_2_ =
                         (ushort)(auVar194._14_2_ + sVar157 + auVar350._14_2_ +
                                 auVar78._14_2_ + auVar84._14_2_) >> lVar72;
                    *pauVar62 = auVar199;
                    pauVar62 = pauVar62 + 1;
                    lVar57 = lVar57 + 1;
                    lVar68 = lVar68 + -1;
                  } while (lVar68 != 0);
                }
              }
              else if (alpha != 0 || beta == 0) {
                if (alpha != 0 && beta == 0) {
                  if (-7 < iVar55) {
                    aiVar2 = av1_filter_8bit[(int)uVar52 >> 10];
                    aiVar3 = av1_filter_8bit[(int)(uVar52 + iVar12) >> 10];
                    auVar232._8_4_ = 0;
                    auVar232[0] = aiVar2[0];
                    auVar232[1] = aiVar2[1];
                    auVar232[2] = aiVar2[2];
                    auVar232[3] = aiVar2[3];
                    auVar232[4] = aiVar2[4];
                    auVar232[5] = aiVar2[5];
                    auVar232[6] = aiVar2[6];
                    auVar232[7] = aiVar2[7];
                    auVar232._12_2_ = aiVar2._6_2_;
                    auVar232._14_2_ = aiVar3._6_2_;
                    auVar231._12_4_ = auVar232._12_4_;
                    auVar231._8_2_ = 0;
                    auVar231[0] = aiVar2[0];
                    auVar231[1] = aiVar2[1];
                    auVar231[2] = aiVar2[2];
                    auVar231[3] = aiVar2[3];
                    auVar231[4] = aiVar2[4];
                    auVar231[5] = aiVar2[5];
                    auVar231[6] = aiVar2[6];
                    auVar231[7] = aiVar2[7];
                    auVar231._10_2_ = aiVar3._4_2_;
                    auVar230._10_6_ = auVar231._10_6_;
                    auVar230._8_2_ = aiVar2._4_2_;
                    auVar230[0] = aiVar2[0];
                    auVar230[1] = aiVar2[1];
                    auVar230[2] = aiVar2[2];
                    auVar230[3] = aiVar2[3];
                    auVar230[4] = aiVar2[4];
                    auVar230[5] = aiVar2[5];
                    auVar230[6] = aiVar2[6];
                    auVar230[7] = aiVar2[7];
                    auVar31._4_8_ = auVar230._8_8_;
                    auVar31._2_2_ = aiVar3._2_2_;
                    auVar31._0_2_ = aiVar2._2_2_;
                    auVar229._0_4_ = CONCAT22(aiVar3._0_2_,aiVar2._0_2_);
                    auVar229._4_12_ = auVar31;
                    aiVar2 = av1_filter_8bit[(int)(uVar52 + iVar66 * 4) >> 10];
                    aiVar3 = av1_filter_8bit[(int)(uVar52 + iVar66 * 6) >> 10];
                    auVar143._8_4_ = 0;
                    auVar143[0] = aiVar2[0];
                    auVar143[1] = aiVar2[1];
                    auVar143[2] = aiVar2[2];
                    auVar143[3] = aiVar2[3];
                    auVar143[4] = aiVar2[4];
                    auVar143[5] = aiVar2[5];
                    auVar143[6] = aiVar2[6];
                    auVar143[7] = aiVar2[7];
                    auVar143._12_2_ = aiVar2._6_2_;
                    auVar143._14_2_ = aiVar3._6_2_;
                    auVar142._12_4_ = auVar143._12_4_;
                    auVar142._8_2_ = 0;
                    auVar142[0] = aiVar2[0];
                    auVar142[1] = aiVar2[1];
                    auVar142[2] = aiVar2[2];
                    auVar142[3] = aiVar2[3];
                    auVar142[4] = aiVar2[4];
                    auVar142[5] = aiVar2[5];
                    auVar142[6] = aiVar2[6];
                    auVar142[7] = aiVar2[7];
                    auVar142._10_2_ = aiVar3._4_2_;
                    auVar141._10_6_ = auVar142._10_6_;
                    auVar141._8_2_ = aiVar2._4_2_;
                    auVar141[0] = aiVar2[0];
                    auVar141[1] = aiVar2[1];
                    auVar141[2] = aiVar2[2];
                    auVar141[3] = aiVar2[3];
                    auVar141[4] = aiVar2[4];
                    auVar141[5] = aiVar2[5];
                    auVar141[6] = aiVar2[6];
                    auVar141[7] = aiVar2[7];
                    auVar32._4_8_ = auVar141._8_8_;
                    auVar32._2_2_ = aiVar3._2_2_;
                    auVar32._0_2_ = aiVar2._2_2_;
                    in_XMM3._6_2_ = aiVar3._0_2_;
                    in_XMM3._4_2_ = aiVar2._0_2_;
                    auVar257._0_8_ = CONCAT44(auVar141._8_4_,auVar230._8_4_);
                    auVar257._8_4_ = auVar231._12_4_;
                    auVar257._12_4_ = auVar142._12_4_;
                    aiVar2 = av1_filter_8bit[(int)(uVar52 + iVar66) >> 10];
                    aiVar3 = av1_filter_8bit[(int)(uVar52 + iVar66 * 3) >> 10];
                    auVar182._8_4_ = 0;
                    auVar182[0] = aiVar2[0];
                    auVar182[1] = aiVar2[1];
                    auVar182[2] = aiVar2[2];
                    auVar182[3] = aiVar2[3];
                    auVar182[4] = aiVar2[4];
                    auVar182[5] = aiVar2[5];
                    auVar182[6] = aiVar2[6];
                    auVar182[7] = aiVar2[7];
                    auVar182._12_2_ = aiVar2._6_2_;
                    auVar182._14_2_ = aiVar3._6_2_;
                    auVar181._12_4_ = auVar182._12_4_;
                    auVar181._8_2_ = 0;
                    auVar181[0] = aiVar2[0];
                    auVar181[1] = aiVar2[1];
                    auVar181[2] = aiVar2[2];
                    auVar181[3] = aiVar2[3];
                    auVar181[4] = aiVar2[4];
                    auVar181[5] = aiVar2[5];
                    auVar181[6] = aiVar2[6];
                    auVar181[7] = aiVar2[7];
                    auVar181._10_2_ = aiVar3._4_2_;
                    auVar180._10_6_ = auVar181._10_6_;
                    auVar180._8_2_ = aiVar2._4_2_;
                    auVar180[0] = aiVar2[0];
                    auVar180[1] = aiVar2[1];
                    auVar180[2] = aiVar2[2];
                    auVar180[3] = aiVar2[3];
                    auVar180[4] = aiVar2[4];
                    auVar180[5] = aiVar2[5];
                    auVar180[6] = aiVar2[6];
                    auVar180[7] = aiVar2[7];
                    auVar33._4_8_ = auVar180._8_8_;
                    auVar33._2_2_ = aiVar3._2_2_;
                    auVar33._0_2_ = aiVar2._2_2_;
                    auVar179._0_4_ = CONCAT22(aiVar3._0_2_,aiVar2._0_2_);
                    auVar179._4_12_ = auVar33;
                    aiVar2 = av1_filter_8bit[(int)(uVar52 + iVar66 * 5) >> 10];
                    aiVar3 = av1_filter_8bit[(int)(uVar52 + iVar66 * 7) >> 10];
                    auVar280._8_4_ = 0;
                    auVar280[0] = aiVar2[0];
                    auVar280[1] = aiVar2[1];
                    auVar280[2] = aiVar2[2];
                    auVar280[3] = aiVar2[3];
                    auVar280[4] = aiVar2[4];
                    auVar280[5] = aiVar2[5];
                    auVar280[6] = aiVar2[6];
                    auVar280[7] = aiVar2[7];
                    auVar280._12_2_ = aiVar2._6_2_;
                    auVar280._14_2_ = aiVar3._6_2_;
                    auVar279._12_4_ = auVar280._12_4_;
                    auVar279._8_2_ = 0;
                    auVar279[0] = aiVar2[0];
                    auVar279[1] = aiVar2[1];
                    auVar279[2] = aiVar2[2];
                    auVar279[3] = aiVar2[3];
                    auVar279[4] = aiVar2[4];
                    auVar279[5] = aiVar2[5];
                    auVar279[6] = aiVar2[6];
                    auVar279[7] = aiVar2[7];
                    auVar279._10_2_ = aiVar3._4_2_;
                    auVar278._10_6_ = auVar279._10_6_;
                    auVar278._8_2_ = aiVar2._4_2_;
                    auVar278[0] = aiVar2[0];
                    auVar278[1] = aiVar2[1];
                    auVar278[2] = aiVar2[2];
                    auVar278[3] = aiVar2[3];
                    auVar278[4] = aiVar2[4];
                    auVar278[5] = aiVar2[5];
                    auVar278[6] = aiVar2[6];
                    auVar278[7] = aiVar2[7];
                    auVar34._4_8_ = auVar278._8_8_;
                    auVar34._2_2_ = aiVar3._2_2_;
                    auVar34._0_2_ = aiVar2._2_2_;
                    in_XMM3._14_2_ = aiVar3._0_2_;
                    in_XMM3._12_2_ = aiVar2._0_2_;
                    auVar294._0_8_ = CONCAT44(auVar278._8_4_,auVar180._8_4_);
                    auVar294._8_4_ = auVar181._12_4_;
                    auVar294._12_4_ = auVar279._12_4_;
                    in_XMM5._8_8_ = auVar294._8_8_;
                    in_XMM5._0_8_ = auVar257._8_8_;
                    in_XMM4._8_8_ = auVar294._0_8_;
                    in_XMM4._0_8_ = auVar257._0_8_;
                    auVar233._0_8_ = auVar229._0_8_;
                    auVar233._8_4_ = auVar31._0_4_;
                    auVar233._12_4_ = auVar32._0_4_;
                    in_XMM3._0_4_ = auVar229._0_4_;
                    auVar183._0_8_ = auVar179._0_8_;
                    auVar183._8_4_ = auVar33._0_4_;
                    auVar183._12_4_ = auVar34._0_4_;
                    in_XMM3._8_4_ = auVar179._0_4_;
                    auVar281._8_8_ = auVar183._8_8_;
                    auVar281._0_8_ = auVar233._8_8_;
                    lVar57 = (long)iVar71 + -7;
                    pauVar62 = (undefined1 (*) [16])local_168;
                    lVar68 = lVar48;
                    do {
                      iVar71 = iVar1;
                      if (lVar57 < lVar64) {
                        iVar71 = (int)lVar57;
                      }
                      if (lVar57 < 0) {
                        iVar71 = 0;
                      }
                      auVar322 = pshufb(*(undefined1 (*) [16])
                                         (ref + (long)(iVar71 * stride) +
                                                ((ulong)(uVar45 & 0x7fffffff) - 7)),auVar301);
                      auVar78 = pshufb(*(undefined1 (*) [16])
                                        (ref + (long)(iVar71 * stride) +
                                               ((ulong)(uVar45 & 0x7fffffff) - 7)),auVar333);
                      auVar144._0_8_ = auVar78._0_8_;
                      auVar295._0_8_ = auVar322._0_8_;
                      auVar295._8_8_ = auVar144._0_8_;
                      auVar340 = pmaddubsw(auVar295,in_XMM3);
                      auVar313._0_8_ = auVar322._4_8_;
                      auVar313._8_4_ = auVar78._4_4_;
                      auVar313._12_4_ = auVar78._8_4_;
                      auVar318 = pmaddubsw(auVar313,auVar281);
                      auVar144._8_8_ = auVar322._2_8_;
                      auVar84 = pmaddubsw(auVar144,in_XMM4);
                      auVar309._0_8_ = auVar78._4_8_;
                      auVar309._8_8_ = auVar322._6_8_;
                      auVar78 = pmaddubsw(auVar309,in_XMM5);
                      auVar296._0_2_ =
                           (ushort)(auVar340._0_2_ + sVar147 + auVar318._0_2_ +
                                   auVar78._0_2_ + auVar84._0_2_) >> lVar72;
                      auVar296._2_2_ =
                           (ushort)(auVar340._2_2_ + sVar151 + auVar318._2_2_ +
                                   auVar78._2_2_ + auVar84._2_2_) >> lVar72;
                      auVar296._4_2_ =
                           (ushort)(auVar340._4_2_ + sVar152 + auVar318._4_2_ +
                                   auVar78._4_2_ + auVar84._4_2_) >> lVar72;
                      auVar296._6_2_ =
                           (ushort)(auVar340._6_2_ + sVar153 + auVar318._6_2_ +
                                   auVar78._6_2_ + auVar84._6_2_) >> lVar72;
                      auVar296._8_2_ =
                           (ushort)(auVar340._8_2_ + sVar154 + auVar318._8_2_ +
                                   auVar78._8_2_ + auVar84._8_2_) >> lVar72;
                      auVar296._10_2_ =
                           (ushort)(auVar340._10_2_ + sVar155 + auVar318._10_2_ +
                                   auVar78._10_2_ + auVar84._10_2_) >> lVar72;
                      auVar296._12_2_ =
                           (ushort)(auVar340._12_2_ + sVar156 + auVar318._12_2_ +
                                   auVar78._12_2_ + auVar84._12_2_) >> lVar72;
                      auVar296._14_2_ =
                           (ushort)(auVar340._14_2_ + sVar157 + auVar318._14_2_ +
                                   auVar78._14_2_ + auVar84._14_2_) >> lVar72;
                      *pauVar62 = auVar296;
                      pauVar62 = pauVar62 + 1;
                      lVar57 = lVar57 + 1;
                      lVar68 = lVar68 + -1;
                    } while (lVar68 != 0);
                  }
                }
                else if (-7 < iVar55) {
                  iVar67 = uVar70 + iVar63;
                  lVar57 = (long)iVar71 + -7;
                  pauVar62 = (undefined1 (*) [16])local_168;
                  lVar68 = lVar48;
                  do {
                    iVar71 = iVar1;
                    if (lVar57 < lVar64) {
                      iVar71 = (int)lVar57;
                    }
                    if (lVar57 < 0) {
                      iVar71 = 0;
                    }
                    aiVar2 = av1_filter_8bit[iVar67 >> 10];
                    aiVar3 = av1_filter_8bit[iVar66 + iVar67 >> 10];
                    iVar46 = iVar66 + iVar12 + iVar67;
                    aiVar4 = av1_filter_8bit[iVar12 + iVar67 >> 10];
                    auVar261._8_4_ = 0;
                    auVar261[0] = aiVar2[0];
                    auVar261[1] = aiVar2[1];
                    auVar261[2] = aiVar2[2];
                    auVar261[3] = aiVar2[3];
                    auVar261[4] = aiVar2[4];
                    auVar261[5] = aiVar2[5];
                    auVar261[6] = aiVar2[6];
                    auVar261[7] = aiVar2[7];
                    auVar261._12_2_ = aiVar2._6_2_;
                    auVar261._14_2_ = aiVar4._6_2_;
                    auVar260._12_4_ = auVar261._12_4_;
                    auVar260._8_2_ = 0;
                    auVar260[0] = aiVar2[0];
                    auVar260[1] = aiVar2[1];
                    auVar260[2] = aiVar2[2];
                    auVar260[3] = aiVar2[3];
                    auVar260[4] = aiVar2[4];
                    auVar260[5] = aiVar2[5];
                    auVar260[6] = aiVar2[6];
                    auVar260[7] = aiVar2[7];
                    auVar260._10_2_ = aiVar4._4_2_;
                    auVar259._10_6_ = auVar260._10_6_;
                    auVar259._8_2_ = aiVar2._4_2_;
                    auVar259[0] = aiVar2[0];
                    auVar259[1] = aiVar2[1];
                    auVar259[2] = aiVar2[2];
                    auVar259[3] = aiVar2[3];
                    auVar259[4] = aiVar2[4];
                    auVar259[5] = aiVar2[5];
                    auVar259[6] = aiVar2[6];
                    auVar259[7] = aiVar2[7];
                    auVar35._4_8_ = auVar259._8_8_;
                    auVar35._2_2_ = aiVar4._2_2_;
                    auVar35._0_2_ = aiVar2._2_2_;
                    auVar258._0_4_ = CONCAT22(aiVar4._0_2_,aiVar2._0_2_);
                    auVar258._4_12_ = auVar35;
                    iVar58 = iVar66 + iVar46;
                    aiVar2 = av1_filter_8bit[iVar46 >> 10];
                    auVar274._8_4_ = 0;
                    auVar274[0] = aiVar3[0];
                    auVar274[1] = aiVar3[1];
                    auVar274[2] = aiVar3[2];
                    auVar274[3] = aiVar3[3];
                    auVar274[4] = aiVar3[4];
                    auVar274[5] = aiVar3[5];
                    auVar274[6] = aiVar3[6];
                    auVar274[7] = aiVar3[7];
                    auVar274._12_2_ = aiVar3._6_2_;
                    auVar274._14_2_ = aiVar2._6_2_;
                    auVar273._12_4_ = auVar274._12_4_;
                    auVar273._8_2_ = 0;
                    auVar273[0] = aiVar3[0];
                    auVar273[1] = aiVar3[1];
                    auVar273[2] = aiVar3[2];
                    auVar273[3] = aiVar3[3];
                    auVar273[4] = aiVar3[4];
                    auVar273[5] = aiVar3[5];
                    auVar273[6] = aiVar3[6];
                    auVar273[7] = aiVar3[7];
                    auVar273._10_2_ = aiVar2._4_2_;
                    auVar272._10_6_ = auVar273._10_6_;
                    auVar272._8_2_ = aiVar3._4_2_;
                    auVar272[0] = aiVar3[0];
                    auVar272[1] = aiVar3[1];
                    auVar272[2] = aiVar3[2];
                    auVar272[3] = aiVar3[3];
                    auVar272[4] = aiVar3[4];
                    auVar272[5] = aiVar3[5];
                    auVar272[6] = aiVar3[6];
                    auVar272[7] = aiVar3[7];
                    auVar36._4_8_ = auVar272._8_8_;
                    auVar36._2_2_ = aiVar2._2_2_;
                    auVar36._0_2_ = aiVar3._2_2_;
                    auVar271._0_4_ = CONCAT22(aiVar2._0_2_,aiVar3._0_2_);
                    auVar271._4_12_ = auVar36;
                    iVar46 = iVar66 + iVar58;
                    aiVar2 = av1_filter_8bit[iVar58 >> 10];
                    iVar58 = iVar66 + iVar46;
                    aiVar3 = av1_filter_8bit[iVar46 >> 10];
                    aiVar4 = av1_filter_8bit[iVar58 >> 10];
                    auVar326._8_4_ = 0;
                    auVar326[0] = aiVar2[0];
                    auVar326[1] = aiVar2[1];
                    auVar326[2] = aiVar2[2];
                    auVar326[3] = aiVar2[3];
                    auVar326[4] = aiVar2[4];
                    auVar326[5] = aiVar2[5];
                    auVar326[6] = aiVar2[6];
                    auVar326[7] = aiVar2[7];
                    auVar326._12_2_ = aiVar2._6_2_;
                    auVar326._14_2_ = aiVar4._6_2_;
                    auVar306._12_4_ = auVar326._12_4_;
                    auVar306._8_2_ = 0;
                    auVar306[0] = aiVar2[0];
                    auVar306[1] = aiVar2[1];
                    auVar306[2] = aiVar2[2];
                    auVar306[3] = aiVar2[3];
                    auVar306[4] = aiVar2[4];
                    auVar306[5] = aiVar2[5];
                    auVar306[6] = aiVar2[6];
                    auVar306[7] = aiVar2[7];
                    auVar306._10_2_ = aiVar4._4_2_;
                    auVar247._10_6_ = auVar306._10_6_;
                    auVar247._8_2_ = aiVar2._4_2_;
                    auVar247[0] = aiVar2[0];
                    auVar247[1] = aiVar2[1];
                    auVar247[2] = aiVar2[2];
                    auVar247[3] = aiVar2[3];
                    auVar247[4] = aiVar2[4];
                    auVar247[5] = aiVar2[5];
                    auVar247[6] = aiVar2[6];
                    auVar247[7] = aiVar2[7];
                    auVar37._4_8_ = auVar247._8_8_;
                    auVar37._2_2_ = aiVar4._2_2_;
                    auVar37._0_2_ = aiVar2._2_2_;
                    auVar187._6_2_ = aiVar4._0_2_;
                    auVar187._4_2_ = aiVar2._0_2_;
                    aiVar2 = av1_filter_8bit[iVar66 + iVar58 >> 10];
                    auVar186._8_4_ = 0;
                    auVar186[0] = aiVar3[0];
                    auVar186[1] = aiVar3[1];
                    auVar186[2] = aiVar3[2];
                    auVar186[3] = aiVar3[3];
                    auVar186[4] = aiVar3[4];
                    auVar186[5] = aiVar3[5];
                    auVar186[6] = aiVar3[6];
                    auVar186[7] = aiVar3[7];
                    auVar186._12_2_ = aiVar3._6_2_;
                    auVar186._14_2_ = aiVar2._6_2_;
                    auVar185._12_4_ = auVar186._12_4_;
                    auVar185._8_2_ = 0;
                    auVar185[0] = aiVar3[0];
                    auVar185[1] = aiVar3[1];
                    auVar185[2] = aiVar3[2];
                    auVar185[3] = aiVar3[3];
                    auVar185[4] = aiVar3[4];
                    auVar185[5] = aiVar3[5];
                    auVar185[6] = aiVar3[6];
                    auVar185[7] = aiVar3[7];
                    auVar185._10_2_ = aiVar2._4_2_;
                    auVar184._10_6_ = auVar185._10_6_;
                    auVar184._8_2_ = aiVar3._4_2_;
                    auVar184[0] = aiVar3[0];
                    auVar184[1] = aiVar3[1];
                    auVar184[2] = aiVar3[2];
                    auVar184[3] = aiVar3[3];
                    auVar184[4] = aiVar3[4];
                    auVar184[5] = aiVar3[5];
                    auVar184[6] = aiVar3[6];
                    auVar184[7] = aiVar3[7];
                    auVar38._4_8_ = auVar184._8_8_;
                    auVar38._2_2_ = aiVar2._2_2_;
                    auVar38._0_2_ = aiVar3._2_2_;
                    auVar187._14_2_ = aiVar2._0_2_;
                    auVar187._12_2_ = aiVar3._0_2_;
                    auVar282._0_8_ = auVar258._0_8_;
                    auVar282._8_4_ = auVar35._0_4_;
                    auVar282._12_4_ = auVar37._0_4_;
                    auVar187._0_4_ = auVar258._0_4_;
                    auVar262._0_8_ = CONCAT44(auVar247._8_4_,auVar259._8_4_);
                    auVar262._8_4_ = auVar260._12_4_;
                    auVar262._12_4_ = auVar306._12_4_;
                    auVar145._0_8_ = auVar271._0_8_;
                    auVar145._8_4_ = auVar36._0_4_;
                    auVar145._12_4_ = auVar38._0_4_;
                    auVar187._8_4_ = auVar271._0_4_;
                    auVar275._0_8_ = CONCAT44(auVar184._8_4_,auVar272._8_4_);
                    auVar275._8_4_ = auVar273._12_4_;
                    auVar275._12_4_ = auVar185._12_4_;
                    auVar283._8_8_ = auVar145._8_8_;
                    auVar283._0_8_ = auVar282._8_8_;
                    auVar146._8_8_ = auVar275._0_8_;
                    auVar146._0_8_ = auVar262._0_8_;
                    in_XMM4._8_8_ = auVar275._8_8_;
                    in_XMM4._0_8_ = auVar262._8_8_;
                    auVar84 = pshufb(*(undefined1 (*) [16])
                                      (ref + (long)(iVar71 * stride) +
                                             ((ulong)(uVar45 & 0x7fffffff) - 7)),auVar301);
                    auVar78 = pshufb(*(undefined1 (*) [16])
                                      (ref + (long)(iVar71 * stride) +
                                             ((ulong)(uVar45 & 0x7fffffff) - 7)),auVar333);
                    auVar234._0_8_ = auVar78._0_8_;
                    auVar297._0_8_ = auVar84._0_8_;
                    auVar297._8_8_ = auVar234._0_8_;
                    auVar322 = pmaddubsw(auVar297,auVar187);
                    auVar310._0_8_ = auVar84._4_8_;
                    auVar310._8_4_ = auVar78._4_4_;
                    auVar310._12_4_ = auVar78._8_4_;
                    auVar340 = pmaddubsw(auVar310,auVar283);
                    auVar234._8_8_ = auVar84._2_8_;
                    in_XMM3 = pmaddubsw(auVar234,auVar146);
                    in_XMM5 = auVar84 >> 0x30;
                    auVar188._0_8_ = auVar78._4_8_;
                    auVar188._8_8_ = auVar84._6_8_;
                    auVar78 = pmaddubsw(auVar188,in_XMM4);
                    auVar298._0_2_ =
                         (ushort)(auVar322._0_2_ + sVar147 + auVar340._0_2_ +
                                 auVar78._0_2_ + in_XMM3._0_2_) >> lVar72;
                    auVar298._2_2_ =
                         (ushort)(auVar322._2_2_ + sVar151 + auVar340._2_2_ +
                                 auVar78._2_2_ + in_XMM3._2_2_) >> lVar72;
                    auVar298._4_2_ =
                         (ushort)(auVar322._4_2_ + sVar152 + auVar340._4_2_ +
                                 auVar78._4_2_ + in_XMM3._4_2_) >> lVar72;
                    auVar298._6_2_ =
                         (ushort)(auVar322._6_2_ + sVar153 + auVar340._6_2_ +
                                 auVar78._6_2_ + in_XMM3._6_2_) >> lVar72;
                    auVar298._8_2_ =
                         (ushort)(auVar322._8_2_ + sVar154 + auVar340._8_2_ +
                                 auVar78._8_2_ + in_XMM3._8_2_) >> lVar72;
                    auVar298._10_2_ =
                         (ushort)(auVar322._10_2_ + sVar155 + auVar340._10_2_ +
                                 auVar78._10_2_ + in_XMM3._10_2_) >> lVar72;
                    auVar298._12_2_ =
                         (ushort)(auVar322._12_2_ + sVar156 + auVar340._12_2_ +
                                 auVar78._12_2_ + in_XMM3._12_2_) >> lVar72;
                    auVar298._14_2_ =
                         (ushort)(auVar322._14_2_ + sVar157 + auVar340._14_2_ +
                                 auVar78._14_2_ + in_XMM3._14_2_) >> lVar72;
                    *pauVar62 = auVar298;
                    pauVar62 = pauVar62 + 1;
                    iVar67 = iVar67 + iVar73;
                    lVar57 = lVar57 + 1;
                    lVar68 = lVar68 + -1;
                  } while (lVar68 != 0);
                }
              }
              else if (-7 < iVar55) {
                iVar67 = uVar70 + iVar63;
                lVar57 = (long)iVar71 + -7;
                pauVar62 = (undefined1 (*) [16])local_168;
                lVar68 = lVar48;
                do {
                  iVar71 = iVar1;
                  if (lVar57 < lVar64) {
                    iVar71 = (int)lVar57;
                  }
                  if (lVar57 < 0) {
                    iVar71 = 0;
                  }
                  auVar178._8_8_ = 0;
                  auVar178._0_8_ = av1_filter_8bit[iVar67 >> 10];
                  auVar78 = pshuflw(in_XMM3,auVar178,0);
                  auVar227._0_4_ = auVar78._0_4_;
                  auVar227._4_4_ = auVar227._0_4_;
                  auVar227._8_4_ = auVar227._0_4_;
                  auVar227._12_4_ = auVar227._0_4_;
                  auVar78 = pshuflw(in_XMM4,auVar178,0x55);
                  auVar256._0_4_ = auVar78._0_4_;
                  auVar256._4_4_ = auVar256._0_4_;
                  auVar256._8_4_ = auVar256._0_4_;
                  auVar256._12_4_ = auVar256._0_4_;
                  auVar78 = pshuflw(in_XMM5,auVar178,0xaa);
                  in_XMM5._0_4_ = auVar78._0_4_;
                  in_XMM5._4_4_ = in_XMM5._0_4_;
                  in_XMM5._8_4_ = in_XMM5._0_4_;
                  in_XMM5._12_4_ = in_XMM5._0_4_;
                  auVar322 = pshufb(auVar178,_DAT_00562b90);
                  auVar340 = pshufb(*(undefined1 (*) [16])
                                     (ref + (long)(iVar71 * stride) +
                                            ((ulong)(uVar45 & 0x7fffffff) - 7)),auVar301);
                  auVar78 = pshufb(*(undefined1 (*) [16])
                                    (ref + (long)(iVar71 * stride) +
                                           ((ulong)(uVar45 & 0x7fffffff) - 7)),auVar333);
                  auVar140._0_8_ = auVar78._0_8_;
                  auVar292._0_8_ = auVar340._0_8_;
                  auVar292._8_8_ = auVar140._0_8_;
                  auVar318 = pmaddubsw(auVar292,auVar227);
                  auVar308._0_8_ = auVar340._4_8_;
                  auVar308._8_4_ = auVar78._4_4_;
                  auVar308._12_4_ = auVar78._8_4_;
                  auVar194 = pmaddubsw(auVar308,auVar256);
                  in_XMM4 = auVar340 >> 0x10;
                  auVar140._8_8_ = auVar340._2_8_;
                  auVar84 = pmaddubsw(auVar140,in_XMM5);
                  auVar228._0_8_ = auVar78._4_8_;
                  auVar228._8_8_ = auVar340._6_8_;
                  auVar78 = pmaddubsw(auVar228,auVar322);
                  in_XMM3._0_2_ = auVar78._0_2_ + auVar84._0_2_;
                  in_XMM3._2_2_ = auVar78._2_2_ + auVar84._2_2_;
                  in_XMM3._4_2_ = auVar78._4_2_ + auVar84._4_2_;
                  in_XMM3._6_2_ = auVar78._6_2_ + auVar84._6_2_;
                  in_XMM3._8_2_ = auVar78._8_2_ + auVar84._8_2_;
                  in_XMM3._10_2_ = auVar78._10_2_ + auVar84._10_2_;
                  in_XMM3._12_2_ = auVar78._12_2_ + auVar84._12_2_;
                  in_XMM3._14_2_ = auVar78._14_2_ + auVar84._14_2_;
                  auVar293._0_2_ =
                       (ushort)(auVar318._0_2_ + sVar147 + auVar194._0_2_ + in_XMM3._0_2_) >> lVar72
                  ;
                  auVar293._2_2_ =
                       (ushort)(auVar318._2_2_ + sVar151 + auVar194._2_2_ + in_XMM3._2_2_) >> lVar72
                  ;
                  auVar293._4_2_ =
                       (ushort)(auVar318._4_2_ + sVar152 + auVar194._4_2_ + in_XMM3._4_2_) >> lVar72
                  ;
                  auVar293._6_2_ =
                       (ushort)(auVar318._6_2_ + sVar153 + auVar194._6_2_ + in_XMM3._6_2_) >> lVar72
                  ;
                  auVar293._8_2_ =
                       (ushort)(auVar318._8_2_ + sVar154 + auVar194._8_2_ + in_XMM3._8_2_) >> lVar72
                  ;
                  auVar293._10_2_ =
                       (ushort)(auVar318._10_2_ + sVar155 + auVar194._10_2_ + in_XMM3._10_2_) >>
                       lVar72;
                  auVar293._12_2_ =
                       (ushort)(auVar318._12_2_ + sVar156 + auVar194._12_2_ + in_XMM3._12_2_) >>
                       lVar72;
                  auVar293._14_2_ =
                       (ushort)(auVar318._14_2_ + sVar157 + auVar194._14_2_ + in_XMM3._14_2_) >>
                       lVar72;
                  *pauVar62 = auVar293;
                  pauVar62 = pauVar62 + 1;
                  iVar67 = iVar67 + iVar73;
                  lVar57 = lVar57 + 1;
                  lVar68 = lVar68 + -1;
                } while (lVar68 != 0);
              }
            }
          }
          else if (-7 < iVar55) {
            lVar72 = -7;
            puVar51 = local_168;
            do {
              iVar67 = iVar71 + (int)lVar72;
              if (lVar64 <= iVar71 + lVar72) {
                iVar67 = iVar1;
              }
              if (iVar71 + lVar72 < 0) {
                iVar67 = 0;
              }
              auVar78 = ZEXT416(((uint)ref[iVar67 * stride + width + -1] << (7 - bVar39 & 0x1f)) +
                                iVar54);
              auVar78 = pshuflw(auVar78,auVar78,0);
              uVar74 = auVar78._0_4_;
              *puVar51 = uVar74;
              puVar51[1] = uVar74;
              puVar51[2] = uVar74;
              puVar51[3] = uVar74;
              lVar72 = lVar72 + 1;
              puVar51 = puVar51 + 4;
            } while (lVar72 < lVar43);
          }
          iVar67 = (((uint)lVar56 & 0xfffc) + (iVar40 + iVar69) * -4 & 0xffffffc0) + 0x10200;
          auVar84 = ZEXT416(uVar50);
          auVar322 = ZEXT416(uVar61);
          iVar71 = iVar67 >> 10;
          auVar78 = auVar322;
          if (delta == 0 && gamma == 0) {
            if (0 < iVar55) {
              uVar76 = CONCAT22((short)conv_params->bck_offset,(short)conv_params->fwd_offset);
              uVar74 = *(undefined4 *)av1_warped_filter[iVar71];
              uVar75 = *(undefined4 *)(av1_warped_filter[iVar71] + 2);
              uVar13 = *(undefined4 *)(av1_warped_filter[iVar71] + 4);
              uVar14 = *(undefined4 *)(av1_warped_filter[iVar71] + 6);
              auVar301._4_4_ = uVar74;
              auVar301._0_4_ = uVar74;
              auVar301._8_4_ = uVar74;
              auVar301._12_4_ = uVar74;
              in_XMM5._4_4_ = uVar75;
              in_XMM5._0_4_ = uVar75;
              in_XMM5._8_4_ = uVar75;
              in_XMM5._12_4_ = uVar75;
              auVar333._4_4_ = uVar13;
              auVar333._0_4_ = uVar13;
              auVar333._8_4_ = uVar13;
              auVar333._12_4_ = uVar13;
              bVar11 = bVar44 - (char)conv_params->round_1;
              auVar324._4_4_ = uVar14;
              auVar324._0_4_ = uVar14;
              auVar324._8_4_ = uVar14;
              auVar324._12_4_ = uVar14;
              auVar78 = ZEXT416((-1 << (bVar11 & 0x1f)) + uVar41 + (-1 << (bVar11 - 1 & 0x1f)));
              auVar78 = pshuflw(auVar78,auVar78,0);
              local_2e8 = auVar78._0_2_;
              sStack_2e6 = auVar78._2_2_;
              lVar56 = 0;
              iVar71 = local_318;
              iVar67 = iVar49;
              do {
                auVar78 = *(undefined1 (*) [16])((long)local_168 + lVar56);
                auVar340 = *(undefined1 (*) [16])((long)auStack_158 + lVar56);
                auVar318 = *(undefined1 (*) [16])(auStack_148 + lVar56);
                auVar205._0_12_ = auVar78._0_12_;
                auVar205._12_2_ = auVar78._6_2_;
                auVar205._14_2_ = auVar340._6_2_;
                auVar204._12_4_ = auVar205._12_4_;
                auVar204._0_10_ = auVar78._0_10_;
                auVar204._10_2_ = auVar340._4_2_;
                auVar203._10_6_ = auVar204._10_6_;
                auVar203._0_8_ = auVar78._0_8_;
                auVar203._8_2_ = auVar78._4_2_;
                auVar202._8_8_ = auVar203._8_8_;
                auVar202._6_2_ = auVar340._2_2_;
                auVar202._4_2_ = auVar78._2_2_;
                auVar202._0_2_ = auVar78._0_2_;
                auVar202._2_2_ = auVar340._0_2_;
                auVar98._0_12_ = auVar318._0_12_;
                auVar98._12_2_ = auVar318._6_2_;
                auVar98._14_2_ = *(undefined2 *)((long)auStack_138 + lVar56 + 6);
                auVar97._12_4_ = auVar98._12_4_;
                auVar97._0_10_ = auVar318._0_10_;
                auVar97._10_2_ = *(undefined2 *)((long)auStack_138 + lVar56 + 4);
                auVar96._10_6_ = auVar97._10_6_;
                auVar96._0_8_ = auVar318._0_8_;
                auVar96._8_2_ = auVar318._4_2_;
                auVar95._8_8_ = auVar96._8_8_;
                auVar95._6_2_ = *(undefined2 *)((long)auStack_138 + lVar56 + 2);
                auVar95._4_2_ = auVar318._2_2_;
                auVar95._0_2_ = auVar318._0_2_;
                auVar95._2_2_ = *(undefined2 *)((long)auStack_138 + lVar56);
                auVar194 = *(undefined1 (*) [16])(auStack_128 + lVar56);
                auVar354._0_12_ = auVar194._0_12_;
                auVar354._12_2_ = auVar194._6_2_;
                auVar354._14_2_ = *(undefined2 *)((long)auStack_118 + lVar56 + 6);
                auVar353._12_4_ = auVar354._12_4_;
                auVar353._0_10_ = auVar194._0_10_;
                auVar353._10_2_ = *(undefined2 *)((long)auStack_118 + lVar56 + 4);
                auVar352._10_6_ = auVar353._10_6_;
                auVar352._0_8_ = auVar194._0_8_;
                auVar352._8_2_ = auVar194._4_2_;
                auVar351._8_8_ = auVar352._8_8_;
                auVar351._6_2_ = *(undefined2 *)((long)auStack_118 + lVar56 + 2);
                auVar351._4_2_ = auVar194._2_2_;
                auVar351._0_2_ = auVar194._0_2_;
                auVar351._2_2_ = *(undefined2 *)((long)auStack_118 + lVar56);
                auVar199 = *(undefined1 (*) [16])(auStack_108 + lVar56);
                auVar350 = pmaddwd(auVar202,auVar301);
                auVar290 = pmaddwd(auVar95,in_XMM5);
                auVar209._0_12_ = auVar199._0_12_;
                auVar209._12_2_ = auVar199._6_2_;
                auVar209._14_2_ = *(undefined2 *)((long)auStack_f8 + lVar56 + 6);
                auVar208._12_4_ = auVar209._12_4_;
                auVar208._0_10_ = auVar199._0_10_;
                auVar208._10_2_ = *(undefined2 *)((long)auStack_f8 + lVar56 + 4);
                auVar207._10_6_ = auVar208._10_6_;
                auVar207._0_8_ = auVar199._0_8_;
                auVar207._8_2_ = auVar199._4_2_;
                auVar206._8_8_ = auVar207._8_8_;
                auVar206._6_2_ = *(undefined2 *)((long)auStack_f8 + lVar56 + 2);
                auVar206._4_2_ = auVar199._2_2_;
                auVar206._0_2_ = auVar199._0_2_;
                auVar206._2_2_ = *(undefined2 *)((long)auStack_f8 + lVar56);
                auVar306 = pmaddwd(auVar351,auVar333);
                auVar247 = pmaddwd(auVar206,auVar324);
                iVar46 = auVar247._8_4_ + auVar306._8_4_ + auVar290._8_4_ + auVar350._8_4_;
                iVar58 = auVar247._12_4_ + auVar306._12_4_ + auVar290._12_4_ + auVar350._12_4_;
                auVar242._2_2_ = auVar340._8_2_;
                auVar242._0_2_ = auVar78._8_2_;
                auVar242._4_2_ = auVar78._10_2_;
                auVar242._6_2_ = auVar340._10_2_;
                auVar242._8_2_ = auVar78._12_2_;
                auVar242._10_2_ = auVar340._12_2_;
                auVar242._12_2_ = auVar78._14_2_;
                auVar242._14_2_ = auVar340._14_2_;
                auVar291._2_2_ = *(undefined2 *)((long)auStack_138 + lVar56 + 8);
                auVar291._0_2_ = auVar318._8_2_;
                auVar291._4_2_ = auVar318._10_2_;
                auVar291._6_2_ = *(undefined2 *)((long)auStack_138 + lVar56 + 10);
                auVar291._8_2_ = auVar318._12_2_;
                auVar291._10_2_ = *(undefined2 *)((long)auStack_138 + lVar56 + 0xc);
                auVar291._12_2_ = auVar318._14_2_;
                auVar291._14_2_ = *(undefined2 *)(auStack_128 + lVar56 + -2);
                auVar148._2_2_ = *(undefined2 *)((long)auStack_118 + lVar56 + 8);
                auVar148._0_2_ = auVar194._8_2_;
                auVar148._4_2_ = auVar194._10_2_;
                auVar148._6_2_ = *(undefined2 *)((long)auStack_118 + lVar56 + 10);
                auVar148._8_2_ = auVar194._12_2_;
                auVar148._10_2_ = *(undefined2 *)((long)auStack_118 + lVar56 + 0xc);
                auVar148._12_2_ = auVar194._14_2_;
                auVar148._14_2_ = *(undefined2 *)(auStack_108 + lVar56 + -2);
                auVar341._2_2_ = *(undefined2 *)((long)auStack_f8 + lVar56 + 8);
                auVar341._0_2_ = auVar199._8_2_;
                auVar341._4_2_ = auVar199._10_2_;
                auVar341._6_2_ = *(undefined2 *)((long)auStack_f8 + lVar56 + 10);
                auVar341._8_2_ = auVar199._12_2_;
                auVar341._10_2_ = *(undefined2 *)((long)auStack_f8 + lVar56 + 0xc);
                auVar341._12_2_ = auVar199._14_2_;
                auVar341._14_2_ = *(undefined2 *)((long)auStack_f8 + lVar56 + 0xe);
                in_XMM4 = pmaddwd(auVar242,auVar301);
                auVar340 = pmaddwd(auVar291,in_XMM5);
                auVar78 = pmaddwd(auVar148,auVar333);
                auVar318 = pmaddwd(auVar341,auVar324);
                iVar235 = auVar318._8_4_ + auVar78._8_4_ + auVar340._8_4_ + in_XMM4._8_4_;
                iVar344 = auVar318._12_4_ + auVar78._12_4_ + auVar340._12_4_ + in_XMM4._12_4_;
                in_XMM3._4_4_ = iVar235;
                in_XMM3._0_4_ = iVar46;
                in_XMM3._8_4_ = iVar58;
                in_XMM3._12_4_ = iVar344;
                auVar99._0_4_ =
                     auVar247._0_4_ + auVar306._0_4_ + auVar290._0_4_ + auVar350._0_4_ + iVar53 >>
                     auVar84;
                auVar99._4_4_ =
                     auVar318._0_4_ + auVar78._0_4_ + auVar340._0_4_ + in_XMM4._0_4_ + iVar53 >>
                     auVar84;
                auVar99._8_4_ =
                     auVar247._4_4_ + auVar306._4_4_ + auVar290._4_4_ + auVar350._4_4_ + iVar53 >>
                     auVar84;
                auVar99._12_4_ =
                     auVar318._4_4_ + auVar78._4_4_ + auVar340._4_4_ + in_XMM4._4_4_ + iVar53 >>
                     auVar84;
                if (conv_params->is_compound == 0) {
                  auVar100._4_4_ = auVar99._4_4_;
                  auVar100._0_4_ = auVar99._0_4_;
                  auVar100._8_4_ = auVar99._8_4_;
                  auVar100._12_4_ = auVar99._12_4_;
                  in_XMM3._0_4_ = iVar46 + iVar53 >> auVar84;
                  in_XMM3._4_4_ = iVar235 + iVar53 >> auVar84;
                  in_XMM3._8_4_ = iVar58 + iVar53 >> auVar84;
                  in_XMM3._12_4_ = iVar344 + iVar53 >> auVar84;
                  auVar340 = packssdw(auVar100,in_XMM3);
                  sVar147 = auVar340._0_2_;
                  sVar151 = auVar340._2_2_;
                  sVar152 = auVar340._4_2_;
                  sVar153 = auVar340._6_2_;
                  uVar74 = CONCAT13((0 < sVar153) * (sVar153 < 0x100) * auVar340[6] -
                                    (0xff < sVar153),
                                    CONCAT12((0 < sVar152) * (sVar152 < 0x100) * auVar340[4] -
                                             (0xff < sVar152),
                                             CONCAT11((0 < sVar151) * (sVar151 < 0x100) *
                                                      auVar340[2] - (0xff < sVar151),
                                                      (0 < sVar147) * (sVar147 < 0x100) *
                                                      auVar340[0] - (0xff < sVar147))));
                  sVar154 = auVar340._8_2_;
                  sVar155 = auVar340._10_2_;
                  sVar156 = auVar340._12_2_;
                  sVar157 = auVar340._14_2_;
                  auVar78._0_8_ =
                       CONCAT17((0 < sVar157) * (sVar157 < 0x100) * auVar340[0xe] - (0xff < sVar157)
                                ,CONCAT16((0 < sVar156) * (sVar156 < 0x100) * auVar340[0xc] -
                                          (0xff < sVar156),
                                          CONCAT15((0 < sVar155) * (sVar155 < 0x100) * auVar340[10]
                                                   - (0xff < sVar155),
                                                   CONCAT14((0 < sVar154) * (sVar154 < 0x100) *
                                                            auVar340[8] - (0xff < sVar154),uVar74)))
                               );
                  auVar78[8] = (0 < sVar147) * (sVar147 < 0x100) * auVar340[0] - (0xff < sVar147);
                  auVar78[9] = (0 < sVar151) * (sVar151 < 0x100) * auVar340[2] - (0xff < sVar151);
                  auVar78[10] = (0 < sVar152) * (sVar152 < 0x100) * auVar340[4] - (0xff < sVar152);
                  auVar78[0xb] = (0 < sVar153) * (sVar153 < 0x100) * auVar340[6] - (0xff < sVar153);
                  auVar78[0xc] = (0 < sVar154) * (sVar154 < 0x100) * auVar340[8] - (0xff < sVar154);
                  auVar78[0xd] = (0 < sVar155) * (sVar155 < 0x100) * auVar340[10] - (0xff < sVar155)
                  ;
                  auVar78[0xe] = (0 < sVar156) * (sVar156 < 0x100) * auVar340[0xc] -
                                 (0xff < sVar156);
                  auVar78[0xf] = (0 < sVar157) * (sVar157 < 0x100) * auVar340[0xe] -
                                 (0xff < sVar157);
                  if (p_width == 4) {
                    *(undefined4 *)(pred + iVar71) = uVar74;
                  }
                  else {
                    *(undefined8 *)(pred + iVar71) = auVar78._0_8_;
                  }
                }
                else {
                  iVar345 = conv_params->dst_stride * iVar67 + iVar65;
                  auVar78 = packusdw(auVar99,auVar99);
                  if (conv_params->do_average == 0) {
                    *(long *)(conv_params->dst + iVar345) = auVar78._0_8_;
                  }
                  else {
                    uVar5 = *(ulong *)(conv_params->dst + iVar345);
                    sVar152 = (short)(uVar5 >> 0x30);
                    sVar151 = (short)(uVar5 >> 0x20);
                    auVar169._0_2_ = (short)uVar5;
                    sVar147 = (short)(uVar5 >> 0x10);
                    if (conv_params->use_dist_wtd_comp_avg == 0) {
                      auVar101._0_2_ = auVar78._0_2_ + auVar169._0_2_;
                      auVar101._2_2_ = auVar78._2_2_ + sVar147;
                      auVar101._4_2_ = auVar78._4_2_ + sVar151;
                      auVar101._6_2_ = auVar78._6_2_ + sVar152;
                      auVar101._8_2_ = auVar78._8_2_;
                      auVar101._10_2_ = auVar78._10_2_;
                      auVar101._12_2_ = auVar78._12_2_;
                      auVar101._14_2_ = auVar78._14_2_;
                      auVar78 = psraw(auVar101,1);
                      auVar340 = auVar78;
                    }
                    else {
                      auVar172._8_4_ = 0;
                      auVar172._0_8_ = uVar5;
                      auVar172._12_2_ = sVar152;
                      auVar172._14_2_ = auVar78._6_2_;
                      auVar171._12_4_ = auVar172._12_4_;
                      auVar171._8_2_ = 0;
                      auVar171._0_8_ = uVar5;
                      auVar171._10_2_ = auVar78._4_2_;
                      auVar170._10_6_ = auVar171._10_6_;
                      auVar170._8_2_ = sVar151;
                      auVar170._0_8_ = uVar5;
                      auVar169._8_8_ = auVar170._8_8_;
                      auVar169._6_2_ = auVar78._2_2_;
                      auVar169._4_2_ = sVar147;
                      auVar169._2_2_ = auVar78._0_2_;
                      auVar18._4_4_ = uVar76;
                      auVar18._0_4_ = uVar76;
                      auVar18._8_4_ = uVar76;
                      auVar18._12_4_ = uVar76;
                      auVar340 = pmaddwd(auVar169,auVar18);
                      auVar173._0_4_ = auVar340._0_4_ >> 4;
                      auVar173._4_4_ = auVar340._4_4_ >> 4;
                      auVar173._8_4_ = auVar340._8_4_ >> 4;
                      auVar173._12_4_ = auVar340._12_4_ >> 4;
                      auVar340 = packusdw(auVar173,auVar173);
                    }
                    auVar174._0_2_ = auVar340._0_2_ + local_2e8;
                    auVar174._2_2_ = auVar340._2_2_ + sStack_2e6;
                    auVar174._4_2_ = auVar340._4_2_ + local_2e8;
                    auVar174._6_2_ = auVar340._6_2_ + sStack_2e6;
                    auVar174._8_2_ = auVar340._8_2_ + local_2e8;
                    auVar174._10_2_ = auVar340._10_2_ + sStack_2e6;
                    auVar174._12_2_ = auVar340._12_2_ + local_2e8;
                    auVar174._14_2_ = auVar340._14_2_ + sStack_2e6;
                    auVar340 = psraw(auVar174,auVar322);
                    sVar147 = auVar340._0_2_;
                    sVar151 = auVar340._2_2_;
                    sVar152 = auVar340._4_2_;
                    sVar153 = auVar340._6_2_;
                    *(uint *)(pred + iVar71) =
                         CONCAT13((0 < sVar153) * (sVar153 < 0x100) * auVar340[6] - (0xff < sVar153)
                                  ,CONCAT12((0 < sVar152) * (sVar152 < 0x100) * auVar340[4] -
                                            (0xff < sVar152),
                                            CONCAT11((0 < sVar151) * (sVar151 < 0x100) * auVar340[2]
                                                     - (0xff < sVar151),
                                                     (0 < sVar147) * (sVar147 < 0x100) * auVar340[0]
                                                     - (0xff < sVar147))));
                  }
                  if (4 < p_width) {
                    auVar210._0_4_ = iVar46 + iVar53 >> auVar84;
                    auVar210._4_4_ = iVar235 + iVar53 >> auVar84;
                    auVar210._8_4_ = iVar58 + iVar53 >> auVar84;
                    auVar210._12_4_ = iVar344 + iVar53 >> auVar84;
                    lVar72 = (long)(conv_params->dst_stride * iVar67 + iVar65);
                    in_XMM3 = packusdw(auVar210,auVar210);
                    if (conv_params->do_average == 0) {
                      *(long *)(conv_params->dst + lVar72 + 4) = in_XMM3._0_8_;
                    }
                    else {
                      uVar5 = *(ulong *)(conv_params->dst + lVar72 + 4);
                      sVar152 = (short)(uVar5 >> 0x30);
                      sVar151 = (short)(uVar5 >> 0x20);
                      auVar102._0_2_ = (short)uVar5;
                      sVar147 = (short)(uVar5 >> 0x10);
                      if (conv_params->use_dist_wtd_comp_avg == 0) {
                        auVar211._0_2_ = in_XMM3._0_2_ + auVar102._0_2_;
                        auVar211._2_2_ = in_XMM3._2_2_ + sVar147;
                        auVar211._4_2_ = in_XMM3._4_2_ + sVar151;
                        auVar211._6_2_ = in_XMM3._6_2_ + sVar152;
                        auVar211._8_2_ = in_XMM3._8_2_;
                        auVar211._10_2_ = in_XMM3._10_2_;
                        auVar211._12_2_ = in_XMM3._12_2_;
                        auVar211._14_2_ = in_XMM3._14_2_;
                        auVar78 = psraw(auVar211,1);
                        in_XMM3 = auVar78;
                      }
                      else {
                        auVar105._8_4_ = 0;
                        auVar105._0_8_ = uVar5;
                        auVar105._12_2_ = sVar152;
                        auVar105._14_2_ = in_XMM3._6_2_;
                        auVar104._12_4_ = auVar105._12_4_;
                        auVar104._8_2_ = 0;
                        auVar104._0_8_ = uVar5;
                        auVar104._10_2_ = in_XMM3._4_2_;
                        auVar103._10_6_ = auVar104._10_6_;
                        auVar103._8_2_ = sVar151;
                        auVar103._0_8_ = uVar5;
                        auVar102._8_8_ = auVar103._8_8_;
                        auVar102._6_2_ = in_XMM3._2_2_;
                        auVar102._4_2_ = sVar147;
                        auVar102._2_2_ = in_XMM3._0_2_;
                        auVar19._4_4_ = uVar76;
                        auVar19._0_4_ = uVar76;
                        auVar19._8_4_ = uVar76;
                        auVar19._12_4_ = uVar76;
                        auVar78 = pmaddwd(auVar102,auVar19);
                        auVar106._0_4_ = auVar78._0_4_ >> 4;
                        auVar106._4_4_ = auVar78._4_4_ >> 4;
                        auVar106._8_4_ = auVar78._8_4_ >> 4;
                        auVar106._12_4_ = auVar78._12_4_ >> 4;
                        auVar78 = packusdw(auVar106,auVar106);
                      }
                      auVar107._0_2_ = auVar78._0_2_ + local_2e8;
                      auVar107._2_2_ = auVar78._2_2_ + sStack_2e6;
                      auVar107._4_2_ = auVar78._4_2_ + local_2e8;
                      auVar107._6_2_ = auVar78._6_2_ + sStack_2e6;
                      auVar107._8_2_ = auVar78._8_2_ + local_2e8;
                      auVar107._10_2_ = auVar78._10_2_ + sStack_2e6;
                      auVar107._12_2_ = auVar78._12_2_ + local_2e8;
                      auVar107._14_2_ = auVar78._14_2_ + sStack_2e6;
                      auVar340 = psraw(auVar107,auVar322);
                      sVar147 = auVar340._0_2_;
                      sVar151 = auVar340._2_2_;
                      sVar152 = auVar340._4_2_;
                      sVar153 = auVar340._6_2_;
                      auVar78._0_4_ =
                           CONCAT13((0 < sVar153) * (sVar153 < 0x100) * auVar340[6] -
                                    (0xff < sVar153),
                                    CONCAT12((0 < sVar152) * (sVar152 < 0x100) * auVar340[4] -
                                             (0xff < sVar152),
                                             CONCAT11((0 < sVar151) * (sVar151 < 0x100) *
                                                      auVar340[2] - (0xff < sVar151),
                                                      (0 < sVar147) * (sVar147 < 0x100) *
                                                      auVar340[0] - (0xff < sVar147))));
                      sVar154 = auVar340._8_2_;
                      auVar78[4] = (0 < sVar154) * (sVar154 < 0x100) * auVar340[8] -
                                   (0xff < sVar154);
                      sVar155 = auVar340._10_2_;
                      auVar78[5] = (0 < sVar155) * (sVar155 < 0x100) * auVar340[10] -
                                   (0xff < sVar155);
                      sVar156 = auVar340._12_2_;
                      auVar78[6] = (0 < sVar156) * (sVar156 < 0x100) * auVar340[0xc] -
                                   (0xff < sVar156);
                      sVar157 = auVar340._14_2_;
                      auVar78[7] = (0 < sVar157) * (sVar157 < 0x100) * auVar340[0xe] -
                                   (0xff < sVar157);
                      auVar78[8] = (0 < sVar147) * (sVar147 < 0x100) * auVar340[0] -
                                   (0xff < sVar147);
                      auVar78[9] = (0 < sVar151) * (sVar151 < 0x100) * auVar340[2] -
                                   (0xff < sVar151);
                      auVar78[10] = (0 < sVar152) * (sVar152 < 0x100) * auVar340[4] -
                                    (0xff < sVar152);
                      auVar78[0xb] = (0 < sVar153) * (sVar153 < 0x100) * auVar340[6] -
                                     (0xff < sVar153);
                      auVar78[0xc] = (0 < sVar154) * (sVar154 < 0x100) * auVar340[8] -
                                     (0xff < sVar154);
                      auVar78[0xd] = (0 < sVar155) * (sVar155 < 0x100) * auVar340[10] -
                                     (0xff < sVar155);
                      auVar78[0xe] = (0 < sVar156) * (sVar156 < 0x100) * auVar340[0xc] -
                                     (0xff < sVar156);
                      auVar78[0xf] = (0 < sVar157) * (sVar157 < 0x100) * auVar340[0xe] -
                                     (0xff < sVar157);
                      *(undefined4 *)(pred + (long)iVar71 + 4) = auVar78._0_4_;
                    }
                  }
                }
                iVar71 = iVar71 + p_stride;
                lVar56 = lVar56 + 0x10;
                iVar67 = iVar67 + 1;
              } while (lVar9 != lVar56);
            }
          }
          else if (gamma != 0 || delta == 0) {
            if (gamma != 0 && delta == 0) {
              if (0 < iVar55) {
                uVar76 = CONCAT22((short)conv_params->bck_offset,(short)conv_params->fwd_offset);
                iVar46 = iVar67 + iVar69 >> 10;
                uVar74 = *(undefined4 *)av1_warped_filter[iVar46];
                uVar75 = *(undefined4 *)(av1_warped_filter[iVar46] + 4);
                aWVar6 = av1_warped_filter[iVar69 * 3 + iVar67 >> 10];
                iVar58 = iVar69 * 5 + iVar67 >> 10;
                local_48 = *(undefined4 *)(av1_warped_filter[iVar58] + 2);
                uVar14 = *(undefined4 *)(av1_warped_filter[iVar58] + 4);
                iVar235 = iVar67 + iVar69 * 7 >> 10;
                uStack_44 = *(undefined4 *)(av1_warped_filter[iVar235] + 2);
                uVar13 = *(undefined4 *)(av1_warped_filter[iVar235] + 4);
                uStack_38 = *(undefined4 *)(av1_warped_filter[iVar58] + 6);
                uStack_34 = *(undefined4 *)(av1_warped_filter[iVar235] + 6);
                auVar10._4_8_ = aWVar6._8_8_;
                auVar10._0_4_ = aWVar6._0_4_;
                auVar108._0_8_ = auVar10._0_8_ << 0x20;
                auVar108._8_4_ = *(undefined4 *)(av1_warped_filter[iVar46] + 2);
                auVar108._12_4_ = aWVar6._4_4_;
                local_58 = auVar108._8_8_;
                WStack_2e4 = aWVar6[0];
                WStack_2e2 = aWVar6[1];
                uStack_2e0 = (undefined2)*(undefined4 *)av1_warped_filter[iVar58];
                uStack_2de = (undefined2)((uint)*(undefined4 *)av1_warped_filter[iVar58] >> 0x10);
                uStack_2dc = (undefined2)*(undefined4 *)av1_warped_filter[iVar235];
                uStack_2da = (undefined2)((uint)*(undefined4 *)av1_warped_filter[iVar235] >> 0x10);
                aWVar7 = av1_warped_filter[iVar71];
                iVar71 = iVar69 * 2 + iVar67 >> 10;
                auVar355._0_8_ =
                     CONCAT44(*(undefined4 *)(av1_warped_filter[iVar71] + 4),aWVar7._8_4_);
                auVar355._8_4_ = aWVar7._12_4_;
                auVar355._12_4_ = *(undefined4 *)(av1_warped_filter[iVar71] + 6);
                aWVar8 = av1_warped_filter[iVar69 * 4 + iVar67 >> 10];
                iVar67 = iVar67 + iVar69 * 6 >> 10;
                auVar212._0_8_ =
                     CONCAT44(*(undefined4 *)(av1_warped_filter[iVar67] + 4),aWVar8._8_4_);
                auVar212._8_4_ = aWVar8._12_4_;
                auVar212._12_4_ = *(undefined4 *)(av1_warped_filter[iVar67] + 6);
                auVar358._8_8_ = auVar212._8_8_;
                auVar358._0_8_ = auVar355._8_8_;
                auVar356._8_8_ = auVar212._0_8_;
                auVar356._0_8_ = auVar355._0_8_;
                auVar268._0_8_ = aWVar7._0_8_;
                auVar268._8_4_ = aWVar7._4_4_;
                auVar268._12_4_ = *(undefined4 *)(av1_warped_filter[iVar71] + 2);
                in_XMM5._0_4_ = aWVar7._0_4_;
                in_XMM5._4_4_ = *(undefined4 *)av1_warped_filter[iVar71];
                auVar149._0_8_ = aWVar8._0_8_;
                auVar149._8_4_ = aWVar8._4_4_;
                auVar149._12_4_ = *(undefined4 *)(av1_warped_filter[iVar67] + 2);
                in_XMM5._12_4_ = *(undefined4 *)av1_warped_filter[iVar67];
                in_XMM5._8_4_ = aWVar8._0_4_;
                auVar342._8_8_ = auVar149._8_8_;
                auVar342._0_8_ = auVar268._8_8_;
                bVar11 = bVar44 - (char)conv_params->round_1;
                auVar78 = ZEXT416((-1 << (bVar11 & 0x1f)) + uVar41 + (-1 << (bVar11 - 1 & 0x1f)));
                auVar301 = pshuflw(auVar78,auVar78,0);
                lVar56 = 0;
                iVar71 = local_318;
                iVar67 = iVar49;
                do {
                  auVar78 = *(undefined1 (*) [16])((long)local_168 + lVar56);
                  auVar333 = *(undefined1 (*) [16])(auStack_148 + lVar56);
                  auVar340 = *(undefined1 (*) [16])((long)auStack_138 + lVar56);
                  auVar112._0_12_ = auVar78._0_12_;
                  auVar112._12_2_ = auVar78._6_2_;
                  auVar112._14_2_ = *(undefined2 *)((long)auStack_158 + lVar56 + 6);
                  auVar111._12_4_ = auVar112._12_4_;
                  auVar111._0_10_ = auVar78._0_10_;
                  auVar111._10_2_ = *(undefined2 *)((long)auStack_158 + lVar56 + 4);
                  auVar110._10_6_ = auVar111._10_6_;
                  auVar110._0_8_ = auVar78._0_8_;
                  auVar110._8_2_ = auVar78._4_2_;
                  auVar109._8_8_ = auVar110._8_8_;
                  auVar109._6_2_ = *(undefined2 *)((long)auStack_158 + lVar56 + 2);
                  auVar109._4_2_ = auVar78._2_2_;
                  auVar109._0_2_ = auVar78._0_2_;
                  auVar109._2_2_ = *(undefined2 *)((long)auStack_158 + lVar56);
                  auVar290 = pmaddwd(auVar109,in_XMM5);
                  auVar246._0_12_ = auVar333._0_12_;
                  auVar246._12_2_ = auVar333._6_2_;
                  auVar246._14_2_ = auVar340._6_2_;
                  auVar245._12_4_ = auVar246._12_4_;
                  auVar245._0_10_ = auVar333._0_10_;
                  auVar245._10_2_ = auVar340._4_2_;
                  auVar244._10_6_ = auVar245._10_6_;
                  auVar244._0_8_ = auVar333._0_8_;
                  auVar244._8_2_ = auVar333._4_2_;
                  auVar243._8_8_ = auVar244._8_8_;
                  auVar243._6_2_ = auVar340._2_2_;
                  auVar243._4_2_ = auVar333._2_2_;
                  auVar243._0_2_ = auVar333._0_2_;
                  auVar243._2_2_ = auVar340._0_2_;
                  auVar247 = pmaddwd(auVar243,auVar342);
                  auVar318 = *(undefined1 (*) [16])(auStack_128 + lVar56);
                  auVar194 = *(undefined1 (*) [16])((long)auStack_118 + lVar56);
                  auVar305._0_12_ = auVar318._0_12_;
                  auVar305._12_2_ = auVar318._6_2_;
                  auVar305._14_2_ = auVar194._6_2_;
                  auVar304._12_4_ = auVar305._12_4_;
                  auVar304._0_10_ = auVar318._0_10_;
                  auVar304._10_2_ = auVar194._4_2_;
                  auVar303._10_6_ = auVar304._10_6_;
                  auVar303._0_8_ = auVar318._0_8_;
                  auVar303._8_2_ = auVar318._4_2_;
                  auVar302._8_8_ = auVar303._8_8_;
                  auVar302._6_2_ = auVar194._2_2_;
                  auVar302._4_2_ = auVar318._2_2_;
                  auVar302._0_2_ = auVar318._0_2_;
                  auVar302._2_2_ = auVar194._0_2_;
                  auVar306 = pmaddwd(auVar302,auVar356);
                  auVar199 = *(undefined1 (*) [16])(auStack_108 + lVar56);
                  auVar216._0_12_ = auVar199._0_12_;
                  auVar216._12_2_ = auVar199._6_2_;
                  auVar216._14_2_ = *(undefined2 *)((long)auStack_f8 + lVar56 + 6);
                  auVar215._12_4_ = auVar216._12_4_;
                  auVar215._0_10_ = auVar199._0_10_;
                  auVar215._10_2_ = *(undefined2 *)((long)auStack_f8 + lVar56 + 4);
                  auVar214._10_6_ = auVar215._10_6_;
                  auVar214._0_8_ = auVar199._0_8_;
                  auVar214._8_2_ = auVar199._4_2_;
                  auVar213._8_8_ = auVar214._8_8_;
                  auVar213._6_2_ = *(undefined2 *)((long)auStack_f8 + lVar56 + 2);
                  auVar213._4_2_ = auVar199._2_2_;
                  auVar213._0_2_ = auVar199._0_2_;
                  auVar213._2_2_ = *(undefined2 *)((long)auStack_f8 + lVar56);
                  auVar350 = pmaddwd(auVar213,auVar358);
                  iVar46 = auVar350._8_4_ + auVar306._8_4_ + auVar247._8_4_ + auVar290._8_4_;
                  iVar58 = auVar350._12_4_ + auVar306._12_4_ + auVar247._12_4_ + auVar290._12_4_;
                  auVar175._2_2_ = *(undefined2 *)((long)auStack_158 + lVar56 + 8);
                  auVar175._0_2_ = auVar78._8_2_;
                  auVar175._4_2_ = auVar78._10_2_;
                  auVar175._6_2_ = *(undefined2 *)((long)auStack_158 + lVar56 + 10);
                  auVar175._8_2_ = auVar78._12_2_;
                  auVar175._10_2_ = *(undefined2 *)((long)auStack_158 + lVar56 + 0xc);
                  auVar175._12_2_ = auVar78._14_2_;
                  auVar175._14_2_ = *(undefined2 *)(auStack_148 + lVar56 + -2);
                  auVar325._2_2_ = auVar340._8_2_;
                  auVar325._0_2_ = auVar333._8_2_;
                  auVar325._4_2_ = auVar333._10_2_;
                  auVar325._6_2_ = auVar340._10_2_;
                  auVar325._8_2_ = auVar333._12_2_;
                  auVar325._10_2_ = auVar340._12_2_;
                  auVar325._12_2_ = auVar333._14_2_;
                  auVar325._14_2_ = auVar340._14_2_;
                  auVar15._4_2_ = WStack_2e4;
                  auVar15._0_4_ = uVar74;
                  auVar15._6_2_ = WStack_2e2;
                  auVar15._8_2_ = uStack_2e0;
                  auVar15._10_2_ = uStack_2de;
                  auVar15._12_2_ = uStack_2dc;
                  auVar15._14_2_ = uStack_2da;
                  auVar333 = pmaddwd(auVar175,auVar15);
                  auVar25._8_8_ = uStack_50;
                  auVar25._0_8_ = auVar108._8_8_;
                  auVar326 = pmaddwd(auVar325,auVar25);
                  auVar315._2_2_ = auVar194._8_2_;
                  auVar315._0_2_ = auVar318._8_2_;
                  auVar315._4_2_ = auVar318._10_2_;
                  auVar315._6_2_ = auVar194._10_2_;
                  auVar315._8_2_ = auVar318._12_2_;
                  auVar315._10_2_ = auVar194._12_2_;
                  auVar315._12_2_ = auVar318._14_2_;
                  auVar315._14_2_ = auVar194._14_2_;
                  auVar113._2_2_ = *(undefined2 *)((long)auStack_f8 + lVar56 + 8);
                  auVar113._0_2_ = auVar199._8_2_;
                  auVar113._4_2_ = auVar199._10_2_;
                  auVar113._6_2_ = *(undefined2 *)((long)auStack_f8 + lVar56 + 10);
                  auVar113._8_2_ = auVar199._12_2_;
                  auVar113._10_2_ = *(undefined2 *)((long)auStack_f8 + lVar56 + 0xc);
                  auVar113._12_2_ = auVar199._14_2_;
                  auVar113._14_2_ = *(undefined2 *)((long)auStack_f8 + lVar56 + 0xe);
                  auVar20._4_4_ = aWVar6._8_4_;
                  auVar20._0_4_ = uVar75;
                  auVar20._8_4_ = uVar14;
                  auVar20._12_4_ = uVar13;
                  auVar340 = pmaddwd(auVar315,auVar20);
                  auVar26._4_4_ = uStack_44;
                  auVar26._0_4_ = local_48;
                  auVar26._8_8_ = uStack_40;
                  auVar78 = pmaddwd(auVar113,auVar26);
                  auVar114._0_4_ = auVar78._0_4_ + auVar340._0_4_ + auVar326._0_4_ + auVar333._0_4_;
                  auVar114._4_4_ = auVar78._4_4_ + auVar340._4_4_ + auVar326._4_4_ + auVar333._4_4_;
                  auVar114._8_4_ = auVar78._8_4_ + auVar340._8_4_ + auVar326._8_4_ + auVar333._8_4_;
                  auVar114._12_4_ =
                       auVar78._12_4_ + auVar340._12_4_ + auVar326._12_4_ + auVar333._12_4_;
                  in_XMM3._4_4_ = auVar114._8_4_;
                  in_XMM3._0_4_ = iVar46;
                  in_XMM3._8_4_ = iVar58;
                  in_XMM3._12_4_ = auVar114._12_4_;
                  auVar248._0_4_ =
                       auVar350._0_4_ + auVar306._0_4_ + auVar247._0_4_ + auVar290._0_4_ + iVar53 >>
                       auVar84;
                  auVar248._4_4_ = auVar114._0_4_ + iVar53 >> auVar84;
                  auVar248._8_4_ =
                       auVar350._4_4_ + auVar306._4_4_ + auVar247._4_4_ + auVar290._4_4_ + iVar53 >>
                       auVar84;
                  auVar248._12_4_ = auVar114._4_4_ + iVar53 >> auVar84;
                  if (conv_params->is_compound == 0) {
                    auVar249._4_4_ = auVar248._4_4_;
                    auVar249._0_4_ = auVar248._0_4_;
                    auVar249._8_4_ = auVar248._8_4_;
                    auVar249._12_4_ = auVar248._12_4_;
                    in_XMM3._0_4_ = iVar46 + iVar53 >> auVar84;
                    in_XMM3._4_4_ = auVar114._8_4_ + iVar53 >> auVar84;
                    in_XMM3._8_4_ = iVar58 + iVar53 >> auVar84;
                    in_XMM3._12_4_ = auVar114._12_4_ + iVar53 >> auVar84;
                    auVar78 = packssdw(auVar249,in_XMM3);
                    sVar147 = auVar78._0_2_;
                    sVar151 = auVar78._2_2_;
                    sVar152 = auVar78._4_2_;
                    sVar153 = auVar78._6_2_;
                    uVar236 = CONCAT13((0 < sVar153) * (sVar153 < 0x100) * auVar78[6] -
                                       (0xff < sVar153),
                                       CONCAT12((0 < sVar152) * (sVar152 < 0x100) * auVar78[4] -
                                                (0xff < sVar152),
                                                CONCAT11((0 < sVar151) * (sVar151 < 0x100) *
                                                         auVar78[2] - (0xff < sVar151),
                                                         (0 < sVar147) * (sVar147 < 0x100) *
                                                         auVar78[0] - (0xff < sVar147))));
                    sVar154 = auVar78._8_2_;
                    sVar155 = auVar78._10_2_;
                    sVar156 = auVar78._12_2_;
                    sVar157 = auVar78._14_2_;
                    in_XMM4._0_8_ =
                         CONCAT17((0 < sVar157) * (sVar157 < 0x100) * auVar78[0xe] -
                                  (0xff < sVar157),
                                  CONCAT16((0 < sVar156) * (sVar156 < 0x100) * auVar78[0xc] -
                                           (0xff < sVar156),
                                           CONCAT15((0 < sVar155) * (sVar155 < 0x100) * auVar78[10]
                                                    - (0xff < sVar155),
                                                    CONCAT14((0 < sVar154) * (sVar154 < 0x100) *
                                                             auVar78[8] - (0xff < sVar154),uVar236))
                                          ));
                    in_XMM4[8] = (0 < sVar147) * (sVar147 < 0x100) * auVar78[0] - (0xff < sVar147);
                    in_XMM4[9] = (0 < sVar151) * (sVar151 < 0x100) * auVar78[2] - (0xff < sVar151);
                    in_XMM4[10] = (0 < sVar152) * (sVar152 < 0x100) * auVar78[4] - (0xff < sVar152);
                    in_XMM4[0xb] = (0 < sVar153) * (sVar153 < 0x100) * auVar78[6] - (0xff < sVar153)
                    ;
                    in_XMM4[0xc] = (0 < sVar154) * (sVar154 < 0x100) * auVar78[8] - (0xff < sVar154)
                    ;
                    in_XMM4[0xd] = (0 < sVar155) * (sVar155 < 0x100) * auVar78[10] -
                                   (0xff < sVar155);
                    in_XMM4[0xe] = (0 < sVar156) * (sVar156 < 0x100) * auVar78[0xc] -
                                   (0xff < sVar156);
                    in_XMM4[0xf] = (0 < sVar157) * (sVar157 < 0x100) * auVar78[0xe] -
                                   (0xff < sVar157);
                    auVar78 = auVar84;
                    if (p_width == 4) {
                      *(undefined4 *)(pred + iVar71) = uVar236;
                    }
                    else {
                      *(undefined8 *)(pred + iVar71) = in_XMM4._0_8_;
                    }
                  }
                  else {
                    iVar235 = conv_params->dst_stride * iVar67 + iVar65;
                    in_XMM4 = packusdw(auVar248,auVar248);
                    local_178 = auVar301._0_2_;
                    sStack_176 = auVar301._2_2_;
                    if (conv_params->do_average == 0) {
                      *(long *)(conv_params->dst + iVar235) = in_XMM4._0_8_;
                      auVar78 = auVar114;
                    }
                    else {
                      uVar5 = *(ulong *)(conv_params->dst + iVar235);
                      sVar152 = (short)(uVar5 >> 0x30);
                      sVar151 = (short)(uVar5 >> 0x20);
                      auVar115._0_2_ = (short)uVar5;
                      sVar147 = (short)(uVar5 >> 0x10);
                      if (conv_params->use_dist_wtd_comp_avg == 0) {
                        auVar250._0_2_ = in_XMM4._0_2_ + auVar115._0_2_;
                        auVar250._2_2_ = in_XMM4._2_2_ + sVar147;
                        auVar250._4_2_ = in_XMM4._4_2_ + sVar151;
                        auVar250._6_2_ = in_XMM4._6_2_ + sVar152;
                        auVar250._8_2_ = in_XMM4._8_2_;
                        auVar250._10_2_ = in_XMM4._10_2_;
                        auVar250._12_2_ = in_XMM4._12_2_;
                        auVar250._14_2_ = in_XMM4._14_2_;
                        auVar78 = psraw(auVar250,1);
                        in_XMM4 = auVar78;
                      }
                      else {
                        auVar118._8_4_ = 0;
                        auVar118._0_8_ = uVar5;
                        auVar118._12_2_ = sVar152;
                        auVar118._14_2_ = in_XMM4._6_2_;
                        auVar117._12_4_ = auVar118._12_4_;
                        auVar117._8_2_ = 0;
                        auVar117._0_8_ = uVar5;
                        auVar117._10_2_ = in_XMM4._4_2_;
                        auVar116._10_6_ = auVar117._10_6_;
                        auVar116._8_2_ = sVar151;
                        auVar116._0_8_ = uVar5;
                        auVar115._8_8_ = auVar116._8_8_;
                        auVar115._6_2_ = in_XMM4._2_2_;
                        auVar115._4_2_ = sVar147;
                        auVar115._2_2_ = in_XMM4._0_2_;
                        auVar23._4_4_ = uVar76;
                        auVar23._0_4_ = uVar76;
                        auVar23._8_4_ = uVar76;
                        auVar23._12_4_ = uVar76;
                        auVar78 = pmaddwd(auVar115,auVar23);
                        auVar119._0_4_ = auVar78._0_4_ >> 4;
                        auVar119._4_4_ = auVar78._4_4_ >> 4;
                        auVar119._8_4_ = auVar78._8_4_ >> 4;
                        auVar119._12_4_ = auVar78._12_4_ >> 4;
                        auVar78 = packusdw(auVar119,auVar119);
                      }
                      auVar120._0_2_ = auVar78._0_2_ + local_178;
                      auVar120._2_2_ = auVar78._2_2_ + sStack_176;
                      auVar120._4_2_ = auVar78._4_2_ + local_178;
                      auVar120._6_2_ = auVar78._6_2_ + sStack_176;
                      auVar120._8_2_ = auVar78._8_2_ + local_178;
                      auVar120._10_2_ = auVar78._10_2_ + sStack_176;
                      auVar120._12_2_ = auVar78._12_2_ + local_178;
                      auVar120._14_2_ = auVar78._14_2_ + sStack_176;
                      auVar333 = psraw(auVar120,auVar322);
                      sVar147 = auVar333._0_2_;
                      sVar151 = auVar333._2_2_;
                      sVar152 = auVar333._4_2_;
                      sVar153 = auVar333._6_2_;
                      auVar78._0_4_ =
                           CONCAT13((0 < sVar153) * (sVar153 < 0x100) * auVar333[6] -
                                    (0xff < sVar153),
                                    CONCAT12((0 < sVar152) * (sVar152 < 0x100) * auVar333[4] -
                                             (0xff < sVar152),
                                             CONCAT11((0 < sVar151) * (sVar151 < 0x100) *
                                                      auVar333[2] - (0xff < sVar151),
                                                      (0 < sVar147) * (sVar147 < 0x100) *
                                                      auVar333[0] - (0xff < sVar147))));
                      sVar154 = auVar333._8_2_;
                      auVar78[4] = (0 < sVar154) * (sVar154 < 0x100) * auVar333[8] -
                                   (0xff < sVar154);
                      sVar155 = auVar333._10_2_;
                      auVar78[5] = (0 < sVar155) * (sVar155 < 0x100) * auVar333[10] -
                                   (0xff < sVar155);
                      sVar156 = auVar333._12_2_;
                      auVar78[6] = (0 < sVar156) * (sVar156 < 0x100) * auVar333[0xc] -
                                   (0xff < sVar156);
                      sVar157 = auVar333._14_2_;
                      auVar78[7] = (0 < sVar157) * (sVar157 < 0x100) * auVar333[0xe] -
                                   (0xff < sVar157);
                      auVar78[8] = (0 < sVar147) * (sVar147 < 0x100) * auVar333[0] -
                                   (0xff < sVar147);
                      auVar78[9] = (0 < sVar151) * (sVar151 < 0x100) * auVar333[2] -
                                   (0xff < sVar151);
                      auVar78[10] = (0 < sVar152) * (sVar152 < 0x100) * auVar333[4] -
                                    (0xff < sVar152);
                      auVar78[0xb] = (0 < sVar153) * (sVar153 < 0x100) * auVar333[6] -
                                     (0xff < sVar153);
                      auVar78[0xc] = (0 < sVar154) * (sVar154 < 0x100) * auVar333[8] -
                                     (0xff < sVar154);
                      auVar78[0xd] = (0 < sVar155) * (sVar155 < 0x100) * auVar333[10] -
                                     (0xff < sVar155);
                      auVar78[0xe] = (0 < sVar156) * (sVar156 < 0x100) * auVar333[0xc] -
                                     (0xff < sVar156);
                      auVar78[0xf] = (0 < sVar157) * (sVar157 < 0x100) * auVar333[0xe] -
                                     (0xff < sVar157);
                      *(undefined4 *)(pred + iVar71) = auVar78._0_4_;
                    }
                    if (4 < p_width) {
                      auVar217._0_4_ = iVar46 + iVar53 >> auVar84;
                      auVar217._4_4_ = auVar114._8_4_ + iVar53 >> auVar84;
                      auVar217._8_4_ = iVar58 + iVar53 >> auVar84;
                      auVar217._12_4_ = auVar114._12_4_ + iVar53 >> auVar84;
                      lVar72 = (long)(conv_params->dst_stride * iVar67 + iVar65);
                      in_XMM3 = packusdw(auVar217,auVar217);
                      if (conv_params->do_average == 0) {
                        *(long *)(conv_params->dst + lVar72 + 4) = in_XMM3._0_8_;
                      }
                      else {
                        uVar5 = *(ulong *)(conv_params->dst + lVar72 + 4);
                        sVar152 = (short)(uVar5 >> 0x30);
                        sVar151 = (short)(uVar5 >> 0x20);
                        auVar121._0_2_ = (short)uVar5;
                        sVar147 = (short)(uVar5 >> 0x10);
                        if (conv_params->use_dist_wtd_comp_avg == 0) {
                          auVar218._0_2_ = in_XMM3._0_2_ + auVar121._0_2_;
                          auVar218._2_2_ = in_XMM3._2_2_ + sVar147;
                          auVar218._4_2_ = in_XMM3._4_2_ + sVar151;
                          auVar218._6_2_ = in_XMM3._6_2_ + sVar152;
                          auVar218._8_2_ = in_XMM3._8_2_;
                          auVar218._10_2_ = in_XMM3._10_2_;
                          auVar218._12_2_ = in_XMM3._12_2_;
                          auVar218._14_2_ = in_XMM3._14_2_;
                          auVar78 = psraw(auVar218,1);
                          in_XMM3 = auVar78;
                        }
                        else {
                          auVar124._8_4_ = 0;
                          auVar124._0_8_ = uVar5;
                          auVar124._12_2_ = sVar152;
                          auVar124._14_2_ = in_XMM3._6_2_;
                          auVar123._12_4_ = auVar124._12_4_;
                          auVar123._8_2_ = 0;
                          auVar123._0_8_ = uVar5;
                          auVar123._10_2_ = in_XMM3._4_2_;
                          auVar122._10_6_ = auVar123._10_6_;
                          auVar122._8_2_ = sVar151;
                          auVar122._0_8_ = uVar5;
                          auVar121._8_8_ = auVar122._8_8_;
                          auVar121._6_2_ = in_XMM3._2_2_;
                          auVar121._4_2_ = sVar147;
                          auVar121._2_2_ = in_XMM3._0_2_;
                          auVar24._4_4_ = uVar76;
                          auVar24._0_4_ = uVar76;
                          auVar24._8_4_ = uVar76;
                          auVar24._12_4_ = uVar76;
                          auVar78 = pmaddwd(auVar121,auVar24);
                          auVar125._0_4_ = auVar78._0_4_ >> 4;
                          auVar125._4_4_ = auVar78._4_4_ >> 4;
                          auVar125._8_4_ = auVar78._8_4_ >> 4;
                          auVar125._12_4_ = auVar78._12_4_ >> 4;
                          auVar78 = packusdw(auVar125,auVar125);
                        }
                        auVar126._0_2_ = auVar78._0_2_ + local_178;
                        auVar126._2_2_ = auVar78._2_2_ + sStack_176;
                        auVar126._4_2_ = auVar78._4_2_ + local_178;
                        auVar126._6_2_ = auVar78._6_2_ + sStack_176;
                        auVar126._8_2_ = auVar78._8_2_ + local_178;
                        auVar126._10_2_ = auVar78._10_2_ + sStack_176;
                        auVar126._12_2_ = auVar78._12_2_ + local_178;
                        auVar126._14_2_ = auVar78._14_2_ + sStack_176;
                        auVar333 = psraw(auVar126,auVar322);
                        sVar147 = auVar333._0_2_;
                        sVar151 = auVar333._2_2_;
                        sVar152 = auVar333._4_2_;
                        sVar153 = auVar333._6_2_;
                        auVar78._0_4_ =
                             CONCAT13((0 < sVar153) * (sVar153 < 0x100) * auVar333[6] -
                                      (0xff < sVar153),
                                      CONCAT12((0 < sVar152) * (sVar152 < 0x100) * auVar333[4] -
                                               (0xff < sVar152),
                                               CONCAT11((0 < sVar151) * (sVar151 < 0x100) *
                                                        auVar333[2] - (0xff < sVar151),
                                                        (0 < sVar147) * (sVar147 < 0x100) *
                                                        auVar333[0] - (0xff < sVar147))));
                        sVar154 = auVar333._8_2_;
                        auVar78[4] = (0 < sVar154) * (sVar154 < 0x100) * auVar333[8] -
                                     (0xff < sVar154);
                        sVar155 = auVar333._10_2_;
                        auVar78[5] = (0 < sVar155) * (sVar155 < 0x100) * auVar333[10] -
                                     (0xff < sVar155);
                        sVar156 = auVar333._12_2_;
                        auVar78[6] = (0 < sVar156) * (sVar156 < 0x100) * auVar333[0xc] -
                                     (0xff < sVar156);
                        sVar157 = auVar333._14_2_;
                        auVar78[7] = (0 < sVar157) * (sVar157 < 0x100) * auVar333[0xe] -
                                     (0xff < sVar157);
                        auVar78[8] = (0 < sVar147) * (sVar147 < 0x100) * auVar333[0] -
                                     (0xff < sVar147);
                        auVar78[9] = (0 < sVar151) * (sVar151 < 0x100) * auVar333[2] -
                                     (0xff < sVar151);
                        auVar78[10] = (0 < sVar152) * (sVar152 < 0x100) * auVar333[4] -
                                      (0xff < sVar152);
                        auVar78[0xb] = (0 < sVar153) * (sVar153 < 0x100) * auVar333[6] -
                                       (0xff < sVar153);
                        auVar78[0xc] = (0 < sVar154) * (sVar154 < 0x100) * auVar333[8] -
                                       (0xff < sVar154);
                        auVar78[0xd] = (0 < sVar155) * (sVar155 < 0x100) * auVar333[10] -
                                       (0xff < sVar155);
                        auVar78[0xe] = (0 < sVar156) * (sVar156 < 0x100) * auVar333[0xc] -
                                       (0xff < sVar156);
                        auVar78[0xf] = (0 < sVar157) * (sVar157 < 0x100) * auVar333[0xe] -
                                       (0xff < sVar157);
                        *(undefined4 *)(pred + (long)iVar71 + 4) = auVar78._0_4_;
                      }
                    }
                  }
                  iVar71 = iVar71 + p_stride;
                  lVar56 = lVar56 + 0x10;
                  iVar67 = iVar67 + 1;
                } while (lVar9 != lVar56);
              }
            }
            else if (0 < iVar55) {
              uVar74 = CONCAT22((short)conv_params->bck_offset,(short)conv_params->fwd_offset);
              bVar11 = bVar44 - (char)conv_params->round_1;
              auVar78 = ZEXT416((-1 << (bVar11 & 0x1f)) + uVar41 + (-1 << (bVar11 - 1 & 0x1f)));
              auVar78 = pshuflw(auVar78,auVar78,0);
              local_2e8 = auVar78._0_2_;
              sStack_2e6 = auVar78._2_2_;
              lVar56 = 0;
              iVar71 = local_318;
              iVar46 = iVar49;
              do {
                aWVar6 = av1_warped_filter[iVar67 >> 10];
                iVar58 = iVar69 * 2 + iVar67 >> 10;
                aWVar7 = av1_warped_filter[iVar69 * 4 + iVar67 >> 10];
                iVar235 = iVar69 * 6 + iVar67 >> 10;
                auVar219._0_8_ = aWVar6._0_8_;
                auVar219._8_4_ = aWVar6._4_4_;
                auVar219._12_4_ = *(undefined4 *)(av1_warped_filter[iVar58] + 2);
                auVar327._4_4_ = *(undefined4 *)av1_warped_filter[iVar58];
                auVar327._0_4_ = aWVar6._0_4_;
                auVar269._0_8_ = aWVar7._0_8_;
                auVar269._8_4_ = aWVar7._4_4_;
                auVar269._12_4_ = *(undefined4 *)(av1_warped_filter[iVar235] + 2);
                auVar327._12_4_ = *(undefined4 *)av1_warped_filter[iVar235];
                auVar327._8_4_ = aWVar7._0_4_;
                auVar251._0_8_ =
                     CONCAT44(*(undefined4 *)(av1_warped_filter[iVar58] + 4),aWVar6._8_4_);
                auVar251._8_4_ = aWVar6._12_4_;
                auVar251._12_4_ = *(undefined4 *)(av1_warped_filter[iVar58] + 6);
                auVar150._0_8_ =
                     CONCAT44(*(undefined4 *)(av1_warped_filter[iVar235] + 4),aWVar7._8_4_);
                auVar150._8_4_ = aWVar7._12_4_;
                auVar150._12_4_ = *(undefined4 *)(av1_warped_filter[iVar235] + 6);
                auVar220._8_8_ = auVar269._8_8_;
                auVar220._0_8_ = auVar219._8_8_;
                auVar316._8_8_ = auVar150._0_8_;
                auVar316._0_8_ = auVar251._0_8_;
                auVar252._8_8_ = auVar150._8_8_;
                auVar252._0_8_ = auVar251._8_8_;
                aWVar6 = av1_warped_filter[iVar69 + iVar67 >> 10];
                iVar58 = iVar69 * 3 + iVar67 >> 10;
                aWVar7 = av1_warped_filter[iVar69 * 5 + iVar67 >> 10];
                iVar235 = iVar69 * 7 + iVar67 >> 10;
                auVar127._0_8_ = aWVar6._0_8_;
                auVar127._8_4_ = aWVar6._4_4_;
                auVar127._12_4_ = *(undefined4 *)(av1_warped_filter[iVar58] + 2);
                auVar357._4_4_ = *(undefined4 *)av1_warped_filter[iVar58];
                auVar357._0_4_ = aWVar6._0_4_;
                auVar334._0_8_ = aWVar7._0_8_;
                auVar334._8_4_ = aWVar7._4_4_;
                auVar334._12_4_ = *(undefined4 *)(av1_warped_filter[iVar235] + 2);
                auVar357._12_4_ = *(undefined4 *)av1_warped_filter[iVar235];
                auVar357._8_4_ = aWVar7._0_4_;
                auVar270._0_8_ =
                     CONCAT44(*(undefined4 *)(av1_warped_filter[iVar58] + 4),aWVar6._8_4_);
                auVar270._8_4_ = aWVar6._12_4_;
                auVar270._12_4_ = *(undefined4 *)(av1_warped_filter[iVar58] + 6);
                auVar176._0_8_ =
                     CONCAT44(*(undefined4 *)(av1_warped_filter[iVar235] + 4),aWVar7._8_4_);
                auVar176._8_4_ = aWVar7._12_4_;
                auVar176._12_4_ = *(undefined4 *)(av1_warped_filter[iVar235] + 6);
                auVar78._8_8_ = auVar334._8_8_;
                auVar78._0_8_ = auVar127._8_8_;
                auVar343._8_8_ = auVar176._0_8_;
                auVar343._0_8_ = auVar270._0_8_;
                in_XMM5._8_8_ = auVar176._8_8_;
                in_XMM5._0_8_ = auVar270._8_8_;
                auVar301 = *(undefined1 (*) [16])((long)local_168 + lVar56);
                auVar333 = *(undefined1 (*) [16])(auStack_148 + lVar56);
                auVar340 = *(undefined1 (*) [16])((long)auStack_138 + lVar56);
                auVar362._0_12_ = auVar301._0_12_;
                auVar362._12_2_ = auVar301._6_2_;
                auVar362._14_2_ = *(undefined2 *)((long)auStack_158 + lVar56 + 6);
                auVar361._12_4_ = auVar362._12_4_;
                auVar361._0_10_ = auVar301._0_10_;
                auVar361._10_2_ = *(undefined2 *)((long)auStack_158 + lVar56 + 4);
                auVar360._10_6_ = auVar361._10_6_;
                auVar360._0_8_ = auVar301._0_8_;
                auVar360._8_2_ = auVar301._4_2_;
                auVar359._8_8_ = auVar360._8_8_;
                auVar359._6_2_ = *(undefined2 *)((long)auStack_158 + lVar56 + 2);
                auVar359._4_2_ = auVar301._2_2_;
                auVar359._0_2_ = auVar301._0_2_;
                auVar359._2_2_ = *(undefined2 *)((long)auStack_158 + lVar56);
                auVar306 = pmaddwd(auVar359,auVar327);
                auVar338._0_12_ = auVar333._0_12_;
                auVar338._12_2_ = auVar333._6_2_;
                auVar338._14_2_ = auVar340._6_2_;
                auVar337._12_4_ = auVar338._12_4_;
                auVar337._0_10_ = auVar333._0_10_;
                auVar337._10_2_ = auVar340._4_2_;
                auVar336._10_6_ = auVar337._10_6_;
                auVar336._0_8_ = auVar333._0_8_;
                auVar336._8_2_ = auVar333._4_2_;
                auVar335._8_8_ = auVar336._8_8_;
                auVar335._6_2_ = auVar340._2_2_;
                auVar335._4_2_ = auVar333._2_2_;
                auVar335._0_2_ = auVar333._0_2_;
                auVar335._2_2_ = auVar340._0_2_;
                auVar247 = pmaddwd(auVar335,auVar220);
                auVar318 = *(undefined1 (*) [16])(auStack_128 + lVar56);
                auVar331._0_12_ = auVar318._0_12_;
                auVar331._12_2_ = auVar318._6_2_;
                auVar331._14_2_ = *(undefined2 *)((long)auStack_118 + lVar56 + 6);
                auVar330._12_4_ = auVar331._12_4_;
                auVar330._0_10_ = auVar318._0_10_;
                auVar330._10_2_ = *(undefined2 *)((long)auStack_118 + lVar56 + 4);
                auVar329._10_6_ = auVar330._10_6_;
                auVar329._0_8_ = auVar318._0_8_;
                auVar329._8_2_ = auVar318._4_2_;
                auVar328._8_8_ = auVar329._8_8_;
                auVar328._6_2_ = *(undefined2 *)((long)auStack_118 + lVar56 + 2);
                auVar328._4_2_ = auVar318._2_2_;
                auVar328._0_2_ = auVar318._0_2_;
                auVar328._2_2_ = *(undefined2 *)((long)auStack_118 + lVar56);
                auVar350 = pmaddwd(auVar328,auVar316);
                auVar194 = *(undefined1 (*) [16])(auStack_108 + lVar56);
                auVar199 = *(undefined1 (*) [16])((long)auStack_f8 + lVar56);
                auVar224._0_12_ = auVar194._0_12_;
                auVar224._12_2_ = auVar194._6_2_;
                auVar224._14_2_ = auVar199._6_2_;
                auVar223._12_4_ = auVar224._12_4_;
                auVar223._0_10_ = auVar194._0_10_;
                auVar223._10_2_ = auVar199._4_2_;
                auVar222._10_6_ = auVar223._10_6_;
                auVar222._0_8_ = auVar194._0_8_;
                auVar222._8_2_ = auVar194._4_2_;
                auVar221._8_8_ = auVar222._8_8_;
                auVar221._6_2_ = auVar199._2_2_;
                auVar221._4_2_ = auVar194._2_2_;
                auVar221._0_2_ = auVar194._0_2_;
                auVar221._2_2_ = auVar199._0_2_;
                auVar290 = pmaddwd(auVar221,auVar252);
                iVar58 = auVar290._0_4_ + auVar350._0_4_ + auVar247._0_4_ + auVar306._0_4_;
                iVar235 = auVar290._4_4_ + auVar350._4_4_ + auVar247._4_4_ + auVar306._4_4_;
                iVar344 = auVar290._8_4_ + auVar350._8_4_ + auVar247._8_4_ + auVar306._8_4_;
                iVar345 = auVar290._12_4_ + auVar350._12_4_ + auVar247._12_4_ + auVar306._12_4_;
                auVar177._2_2_ = *(undefined2 *)((long)auStack_158 + lVar56 + 8);
                auVar177._0_2_ = auVar301._8_2_;
                auVar177._4_2_ = auVar301._10_2_;
                auVar177._6_2_ = *(undefined2 *)((long)auStack_158 + lVar56 + 10);
                auVar177._8_2_ = auVar301._12_2_;
                auVar177._10_2_ = *(undefined2 *)((long)auStack_158 + lVar56 + 0xc);
                auVar177._12_2_ = auVar301._14_2_;
                auVar177._14_2_ = *(undefined2 *)(auStack_148 + lVar56 + -2);
                auVar301 = pmaddwd(auVar177,auVar357);
                auVar307._2_2_ = auVar340._8_2_;
                auVar307._0_2_ = auVar333._8_2_;
                auVar307._4_2_ = auVar333._10_2_;
                auVar307._6_2_ = auVar340._10_2_;
                auVar307._8_2_ = auVar333._12_2_;
                auVar307._10_2_ = auVar340._12_2_;
                auVar307._12_2_ = auVar333._14_2_;
                auVar307._14_2_ = auVar340._14_2_;
                auVar333 = pmaddwd(auVar307,auVar78);
                auVar312._2_2_ = *(undefined2 *)((long)auStack_118 + lVar56 + 8);
                auVar312._0_2_ = auVar318._8_2_;
                auVar312._4_2_ = auVar318._10_2_;
                auVar312._6_2_ = *(undefined2 *)((long)auStack_118 + lVar56 + 10);
                auVar312._8_2_ = auVar318._12_2_;
                auVar312._10_2_ = *(undefined2 *)((long)auStack_118 + lVar56 + 0xc);
                auVar312._12_2_ = auVar318._14_2_;
                auVar312._14_2_ = *(undefined2 *)(auStack_108 + lVar56 + -2);
                auVar340 = pmaddwd(auVar312,auVar343);
                auVar317._2_2_ = auVar199._8_2_;
                auVar317._0_2_ = auVar194._8_2_;
                auVar317._4_2_ = auVar194._10_2_;
                auVar317._6_2_ = auVar199._10_2_;
                auVar317._8_2_ = auVar194._12_2_;
                auVar317._10_2_ = auVar199._12_2_;
                auVar317._12_2_ = auVar194._14_2_;
                auVar317._14_2_ = auVar199._14_2_;
                auVar318 = pmaddwd(auVar317,in_XMM5);
                iVar59 = auVar318._0_4_ + auVar340._0_4_ + auVar333._0_4_ + auVar301._0_4_;
                iVar319 = auVar318._4_4_ + auVar340._4_4_ + auVar333._4_4_ + auVar301._4_4_;
                iVar320 = auVar318._8_4_ + auVar340._8_4_ + auVar333._8_4_ + auVar301._8_4_;
                iVar321 = auVar318._12_4_ + auVar340._12_4_ + auVar333._12_4_ + auVar301._12_4_;
                in_XMM3._4_4_ = iVar320;
                in_XMM3._0_4_ = iVar344;
                in_XMM3._8_4_ = iVar345;
                in_XMM3._12_4_ = iVar321;
                if (conv_params->is_compound == 0) {
                  auVar254._0_4_ = iVar58 + iVar53 >> auVar84;
                  auVar254._4_4_ = iVar59 + iVar53 >> auVar84;
                  auVar254._8_4_ = iVar235 + iVar53 >> auVar84;
                  auVar254._12_4_ = iVar319 + iVar53 >> auVar84;
                  in_XMM3._0_4_ = iVar344 + iVar53 >> auVar84;
                  in_XMM3._4_4_ = iVar320 + iVar53 >> auVar84;
                  in_XMM3._8_4_ = iVar345 + iVar53 >> auVar84;
                  in_XMM3._12_4_ = iVar321 + iVar53 >> auVar84;
                  auVar78 = packssdw(auVar254,in_XMM3);
                  sVar147 = auVar78._0_2_;
                  sVar151 = auVar78._2_2_;
                  sVar152 = auVar78._4_2_;
                  sVar153 = auVar78._6_2_;
                  uVar75 = CONCAT13((0 < sVar153) * (sVar153 < 0x100) * auVar78[6] -
                                    (0xff < sVar153),
                                    CONCAT12((0 < sVar152) * (sVar152 < 0x100) * auVar78[4] -
                                             (0xff < sVar152),
                                             CONCAT11((0 < sVar151) * (sVar151 < 0x100) * auVar78[2]
                                                      - (0xff < sVar151),
                                                      (0 < sVar147) * (sVar147 < 0x100) * auVar78[0]
                                                      - (0xff < sVar147))));
                  sVar154 = auVar78._8_2_;
                  sVar155 = auVar78._10_2_;
                  sVar156 = auVar78._12_2_;
                  sVar157 = auVar78._14_2_;
                  in_XMM4._0_8_ =
                       CONCAT17((0 < sVar157) * (sVar157 < 0x100) * auVar78[0xe] - (0xff < sVar157),
                                CONCAT16((0 < sVar156) * (sVar156 < 0x100) * auVar78[0xc] -
                                         (0xff < sVar156),
                                         CONCAT15((0 < sVar155) * (sVar155 < 0x100) * auVar78[10] -
                                                  (0xff < sVar155),
                                                  CONCAT14((0 < sVar154) * (sVar154 < 0x100) *
                                                           auVar78[8] - (0xff < sVar154),uVar75))));
                  in_XMM4[8] = (0 < sVar147) * (sVar147 < 0x100) * auVar78[0] - (0xff < sVar147);
                  in_XMM4[9] = (0 < sVar151) * (sVar151 < 0x100) * auVar78[2] - (0xff < sVar151);
                  in_XMM4[10] = (0 < sVar152) * (sVar152 < 0x100) * auVar78[4] - (0xff < sVar152);
                  in_XMM4[0xb] = (0 < sVar153) * (sVar153 < 0x100) * auVar78[6] - (0xff < sVar153);
                  in_XMM4[0xc] = (0 < sVar154) * (sVar154 < 0x100) * auVar78[8] - (0xff < sVar154);
                  in_XMM4[0xd] = (0 < sVar155) * (sVar155 < 0x100) * auVar78[10] - (0xff < sVar155);
                  in_XMM4[0xe] = (0 < sVar156) * (sVar156 < 0x100) * auVar78[0xc] - (0xff < sVar156)
                  ;
                  in_XMM4[0xf] = (0 < sVar157) * (sVar157 < 0x100) * auVar78[0xe] - (0xff < sVar157)
                  ;
                  auVar78 = auVar77;
                  if (p_width == 4) {
                    *(undefined4 *)(pred + iVar71) = uVar75;
                  }
                  else {
                    *(undefined8 *)(pred + iVar71) = in_XMM4._0_8_;
                  }
                }
                else {
                  iVar60 = conv_params->dst_stride * iVar46 + iVar65;
                  auVar253._0_4_ = iVar58 + iVar53 >> auVar84;
                  auVar253._4_4_ = iVar59 + iVar53 >> auVar84;
                  auVar253._8_4_ = iVar235 + iVar53 >> auVar84;
                  auVar253._12_4_ = iVar319 + iVar53 >> auVar84;
                  in_XMM4 = packusdw(auVar253,auVar253);
                  if (conv_params->do_average == 0) {
                    *(long *)(conv_params->dst + iVar60) = in_XMM4._0_8_;
                  }
                  else {
                    uVar5 = *(ulong *)(conv_params->dst + iVar60);
                    sVar152 = (short)(uVar5 >> 0x30);
                    sVar151 = (short)(uVar5 >> 0x20);
                    auVar128._0_2_ = (short)uVar5;
                    sVar147 = (short)(uVar5 >> 0x10);
                    if (conv_params->use_dist_wtd_comp_avg == 0) {
                      auVar255._0_2_ = in_XMM4._0_2_ + auVar128._0_2_;
                      auVar255._2_2_ = in_XMM4._2_2_ + sVar147;
                      auVar255._4_2_ = in_XMM4._4_2_ + sVar151;
                      auVar255._6_2_ = in_XMM4._6_2_ + sVar152;
                      auVar255._8_2_ = in_XMM4._8_2_;
                      auVar255._10_2_ = in_XMM4._10_2_;
                      auVar255._12_2_ = in_XMM4._12_2_;
                      auVar255._14_2_ = in_XMM4._14_2_;
                      auVar78 = psraw(auVar255,1);
                      in_XMM4 = auVar78;
                    }
                    else {
                      auVar131._8_4_ = 0;
                      auVar131._0_8_ = uVar5;
                      auVar131._12_2_ = sVar152;
                      auVar131._14_2_ = in_XMM4._6_2_;
                      auVar130._12_4_ = auVar131._12_4_;
                      auVar130._8_2_ = 0;
                      auVar130._0_8_ = uVar5;
                      auVar130._10_2_ = in_XMM4._4_2_;
                      auVar129._10_6_ = auVar130._10_6_;
                      auVar129._8_2_ = sVar151;
                      auVar129._0_8_ = uVar5;
                      auVar128._8_8_ = auVar129._8_8_;
                      auVar128._6_2_ = in_XMM4._2_2_;
                      auVar128._4_2_ = sVar147;
                      auVar128._2_2_ = in_XMM4._0_2_;
                      auVar21._4_4_ = uVar74;
                      auVar21._0_4_ = uVar74;
                      auVar21._8_4_ = uVar74;
                      auVar21._12_4_ = uVar74;
                      auVar78 = pmaddwd(auVar128,auVar21);
                      auVar132._0_4_ = auVar78._0_4_ >> 4;
                      auVar132._4_4_ = auVar78._4_4_ >> 4;
                      auVar132._8_4_ = auVar78._8_4_ >> 4;
                      auVar132._12_4_ = auVar78._12_4_ >> 4;
                      auVar78 = packusdw(auVar132,auVar132);
                    }
                    auVar133._0_2_ = auVar78._0_2_ + local_2e8;
                    auVar133._2_2_ = auVar78._2_2_ + sStack_2e6;
                    auVar133._4_2_ = auVar78._4_2_ + local_2e8;
                    auVar133._6_2_ = auVar78._6_2_ + sStack_2e6;
                    auVar133._8_2_ = auVar78._8_2_ + local_2e8;
                    auVar133._10_2_ = auVar78._10_2_ + sStack_2e6;
                    auVar133._12_2_ = auVar78._12_2_ + local_2e8;
                    auVar133._14_2_ = auVar78._14_2_ + sStack_2e6;
                    auVar301 = psraw(auVar133,auVar322);
                    sVar147 = auVar301._0_2_;
                    sVar151 = auVar301._2_2_;
                    sVar152 = auVar301._4_2_;
                    sVar153 = auVar301._6_2_;
                    auVar78._0_4_ =
                         CONCAT13((0 < sVar153) * (sVar153 < 0x100) * auVar301[6] - (0xff < sVar153)
                                  ,CONCAT12((0 < sVar152) * (sVar152 < 0x100) * auVar301[4] -
                                            (0xff < sVar152),
                                            CONCAT11((0 < sVar151) * (sVar151 < 0x100) * auVar301[2]
                                                     - (0xff < sVar151),
                                                     (0 < sVar147) * (sVar147 < 0x100) * auVar301[0]
                                                     - (0xff < sVar147))));
                    sVar154 = auVar301._8_2_;
                    auVar78[4] = (0 < sVar154) * (sVar154 < 0x100) * auVar301[8] - (0xff < sVar154);
                    sVar155 = auVar301._10_2_;
                    auVar78[5] = (0 < sVar155) * (sVar155 < 0x100) * auVar301[10] - (0xff < sVar155)
                    ;
                    sVar156 = auVar301._12_2_;
                    auVar78[6] = (0 < sVar156) * (sVar156 < 0x100) * auVar301[0xc] -
                                 (0xff < sVar156);
                    sVar157 = auVar301._14_2_;
                    auVar78[7] = (0 < sVar157) * (sVar157 < 0x100) * auVar301[0xe] -
                                 (0xff < sVar157);
                    auVar78[8] = (0 < sVar147) * (sVar147 < 0x100) * auVar301[0] - (0xff < sVar147);
                    auVar78[9] = (0 < sVar151) * (sVar151 < 0x100) * auVar301[2] - (0xff < sVar151);
                    auVar78[10] = (0 < sVar152) * (sVar152 < 0x100) * auVar301[4] - (0xff < sVar152)
                    ;
                    auVar78[0xb] = (0 < sVar153) * (sVar153 < 0x100) * auVar301[6] -
                                   (0xff < sVar153);
                    auVar78[0xc] = (0 < sVar154) * (sVar154 < 0x100) * auVar301[8] -
                                   (0xff < sVar154);
                    auVar78[0xd] = (0 < sVar155) * (sVar155 < 0x100) * auVar301[10] -
                                   (0xff < sVar155);
                    auVar78[0xe] = (0 < sVar156) * (sVar156 < 0x100) * auVar301[0xc] -
                                   (0xff < sVar156);
                    auVar78[0xf] = (0 < sVar157) * (sVar157 < 0x100) * auVar301[0xe] -
                                   (0xff < sVar157);
                    *(undefined4 *)(pred + iVar71) = auVar78._0_4_;
                  }
                  if (4 < p_width) {
                    auVar225._0_4_ = iVar344 + iVar53 >> auVar84;
                    auVar225._4_4_ = iVar320 + iVar53 >> auVar84;
                    auVar225._8_4_ = iVar345 + iVar53 >> auVar84;
                    auVar225._12_4_ = iVar321 + iVar53 >> auVar84;
                    lVar72 = (long)(conv_params->dst_stride * iVar46 + iVar65);
                    in_XMM3 = packusdw(auVar225,auVar225);
                    if (conv_params->do_average == 0) {
                      *(long *)(conv_params->dst + lVar72 + 4) = in_XMM3._0_8_;
                    }
                    else {
                      uVar5 = *(ulong *)(conv_params->dst + lVar72 + 4);
                      sVar152 = (short)(uVar5 >> 0x30);
                      sVar151 = (short)(uVar5 >> 0x20);
                      auVar134._0_2_ = (short)uVar5;
                      sVar147 = (short)(uVar5 >> 0x10);
                      if (conv_params->use_dist_wtd_comp_avg == 0) {
                        auVar226._0_2_ = in_XMM3._0_2_ + auVar134._0_2_;
                        auVar226._2_2_ = in_XMM3._2_2_ + sVar147;
                        auVar226._4_2_ = in_XMM3._4_2_ + sVar151;
                        auVar226._6_2_ = in_XMM3._6_2_ + sVar152;
                        auVar226._8_2_ = in_XMM3._8_2_;
                        auVar226._10_2_ = in_XMM3._10_2_;
                        auVar226._12_2_ = in_XMM3._12_2_;
                        auVar226._14_2_ = in_XMM3._14_2_;
                        auVar78 = psraw(auVar226,1);
                        in_XMM3 = auVar78;
                      }
                      else {
                        auVar137._8_4_ = 0;
                        auVar137._0_8_ = uVar5;
                        auVar137._12_2_ = sVar152;
                        auVar137._14_2_ = in_XMM3._6_2_;
                        auVar136._12_4_ = auVar137._12_4_;
                        auVar136._8_2_ = 0;
                        auVar136._0_8_ = uVar5;
                        auVar136._10_2_ = in_XMM3._4_2_;
                        auVar135._10_6_ = auVar136._10_6_;
                        auVar135._8_2_ = sVar151;
                        auVar135._0_8_ = uVar5;
                        auVar134._8_8_ = auVar135._8_8_;
                        auVar134._6_2_ = in_XMM3._2_2_;
                        auVar134._4_2_ = sVar147;
                        auVar134._2_2_ = in_XMM3._0_2_;
                        auVar22._4_4_ = uVar74;
                        auVar22._0_4_ = uVar74;
                        auVar22._8_4_ = uVar74;
                        auVar22._12_4_ = uVar74;
                        auVar78 = pmaddwd(auVar134,auVar22);
                        auVar138._0_4_ = auVar78._0_4_ >> 4;
                        auVar138._4_4_ = auVar78._4_4_ >> 4;
                        auVar138._8_4_ = auVar78._8_4_ >> 4;
                        auVar138._12_4_ = auVar78._12_4_ >> 4;
                        auVar78 = packusdw(auVar138,auVar138);
                      }
                      auVar139._0_2_ = auVar78._0_2_ + local_2e8;
                      auVar139._2_2_ = auVar78._2_2_ + sStack_2e6;
                      auVar139._4_2_ = auVar78._4_2_ + local_2e8;
                      auVar139._6_2_ = auVar78._6_2_ + sStack_2e6;
                      auVar139._8_2_ = auVar78._8_2_ + local_2e8;
                      auVar139._10_2_ = auVar78._10_2_ + sStack_2e6;
                      auVar139._12_2_ = auVar78._12_2_ + local_2e8;
                      auVar139._14_2_ = auVar78._14_2_ + sStack_2e6;
                      auVar301 = psraw(auVar139,auVar322);
                      sVar147 = auVar301._0_2_;
                      sVar151 = auVar301._2_2_;
                      sVar152 = auVar301._4_2_;
                      sVar153 = auVar301._6_2_;
                      auVar78._0_4_ =
                           CONCAT13((0 < sVar153) * (sVar153 < 0x100) * auVar301[6] -
                                    (0xff < sVar153),
                                    CONCAT12((0 < sVar152) * (sVar152 < 0x100) * auVar301[4] -
                                             (0xff < sVar152),
                                             CONCAT11((0 < sVar151) * (sVar151 < 0x100) *
                                                      auVar301[2] - (0xff < sVar151),
                                                      (0 < sVar147) * (sVar147 < 0x100) *
                                                      auVar301[0] - (0xff < sVar147))));
                      sVar154 = auVar301._8_2_;
                      auVar78[4] = (0 < sVar154) * (sVar154 < 0x100) * auVar301[8] -
                                   (0xff < sVar154);
                      sVar155 = auVar301._10_2_;
                      auVar78[5] = (0 < sVar155) * (sVar155 < 0x100) * auVar301[10] -
                                   (0xff < sVar155);
                      sVar156 = auVar301._12_2_;
                      auVar78[6] = (0 < sVar156) * (sVar156 < 0x100) * auVar301[0xc] -
                                   (0xff < sVar156);
                      sVar157 = auVar301._14_2_;
                      auVar78[7] = (0 < sVar157) * (sVar157 < 0x100) * auVar301[0xe] -
                                   (0xff < sVar157);
                      auVar78[8] = (0 < sVar147) * (sVar147 < 0x100) * auVar301[0] -
                                   (0xff < sVar147);
                      auVar78[9] = (0 < sVar151) * (sVar151 < 0x100) * auVar301[2] -
                                   (0xff < sVar151);
                      auVar78[10] = (0 < sVar152) * (sVar152 < 0x100) * auVar301[4] -
                                    (0xff < sVar152);
                      auVar78[0xb] = (0 < sVar153) * (sVar153 < 0x100) * auVar301[6] -
                                     (0xff < sVar153);
                      auVar78[0xc] = (0 < sVar154) * (sVar154 < 0x100) * auVar301[8] -
                                     (0xff < sVar154);
                      auVar78[0xd] = (0 < sVar155) * (sVar155 < 0x100) * auVar301[10] -
                                     (0xff < sVar155);
                      auVar78[0xe] = (0 < sVar156) * (sVar156 < 0x100) * auVar301[0xc] -
                                     (0xff < sVar156);
                      auVar78[0xf] = (0 < sVar157) * (sVar157 < 0x100) * auVar301[0xe] -
                                     (0xff < sVar157);
                      *(undefined4 *)(pred + (long)iVar71 + 4) = auVar78._0_4_;
                    }
                  }
                }
                iVar71 = iVar71 + p_stride;
                lVar56 = lVar56 + 0x10;
                iVar46 = iVar46 + 1;
                iVar67 = iVar67 + iVar40;
              } while (lVar9 != lVar56);
            }
          }
          else if (0 < iVar55) {
            uVar74 = CONCAT22((short)conv_params->bck_offset,(short)conv_params->fwd_offset);
            bVar11 = bVar44 - (char)conv_params->round_1;
            auVar78 = ZEXT416((-1 << (bVar11 & 0x1f)) + uVar41 + (-1 << (bVar11 - 1 & 0x1f)));
            auVar78 = pshuflw(auVar78,auVar78,0);
            local_2e8 = auVar78._0_2_;
            sStack_2e6 = auVar78._2_2_;
            lVar56 = 0;
            iVar71 = local_318;
            iVar46 = iVar49;
            do {
              iVar58 = iVar67 >> 10;
              uVar75 = *(undefined4 *)av1_warped_filter[iVar58];
              uVar13 = *(undefined4 *)(av1_warped_filter[iVar58] + 2);
              uVar14 = *(undefined4 *)(av1_warped_filter[iVar58] + 4);
              uVar76 = *(undefined4 *)(av1_warped_filter[iVar58] + 6);
              auVar323._4_4_ = uVar75;
              auVar323._0_4_ = uVar75;
              auVar323._8_4_ = uVar75;
              auVar323._12_4_ = uVar75;
              auVar314._4_4_ = uVar13;
              auVar314._0_4_ = uVar13;
              auVar314._8_4_ = uVar13;
              auVar314._12_4_ = uVar13;
              auVar311._4_4_ = uVar14;
              auVar311._0_4_ = uVar14;
              auVar311._8_4_ = uVar14;
              auVar311._12_4_ = uVar14;
              in_XMM4._4_4_ = uVar76;
              in_XMM4._0_4_ = uVar76;
              in_XMM4._8_4_ = uVar76;
              in_XMM4._12_4_ = uVar76;
              auVar78 = *(undefined1 (*) [16])((long)local_168 + lVar56);
              auVar301 = *(undefined1 (*) [16])(auStack_148 + lVar56);
              auVar333 = *(undefined1 (*) [16])((long)auStack_138 + lVar56);
              auVar193._0_12_ = auVar78._0_12_;
              auVar193._12_2_ = auVar78._6_2_;
              auVar193._14_2_ = *(undefined2 *)((long)auStack_158 + lVar56 + 6);
              auVar192._12_4_ = auVar193._12_4_;
              auVar192._0_10_ = auVar78._0_10_;
              auVar192._10_2_ = *(undefined2 *)((long)auStack_158 + lVar56 + 4);
              auVar191._10_6_ = auVar192._10_6_;
              auVar191._0_8_ = auVar78._0_8_;
              auVar191._8_2_ = auVar78._4_2_;
              auVar190._8_8_ = auVar191._8_8_;
              auVar190._6_2_ = *(undefined2 *)((long)auStack_158 + lVar56 + 2);
              auVar190._4_2_ = auVar78._2_2_;
              auVar190._0_2_ = auVar78._0_2_;
              auVar190._2_2_ = *(undefined2 *)((long)auStack_158 + lVar56);
              auVar289._0_12_ = auVar301._0_12_;
              auVar289._12_2_ = auVar301._6_2_;
              auVar289._14_2_ = auVar333._6_2_;
              auVar288._12_4_ = auVar289._12_4_;
              auVar288._0_10_ = auVar301._0_10_;
              auVar288._10_2_ = auVar333._4_2_;
              auVar287._10_6_ = auVar288._10_6_;
              auVar287._0_8_ = auVar301._0_8_;
              auVar287._8_2_ = auVar301._4_2_;
              auVar286._8_8_ = auVar287._8_8_;
              auVar286._6_2_ = auVar333._2_2_;
              auVar286._4_2_ = auVar301._2_2_;
              auVar286._0_2_ = auVar301._0_2_;
              auVar286._2_2_ = auVar333._0_2_;
              auVar340 = *(undefined1 (*) [16])(auStack_128 + lVar56);
              auVar349._0_12_ = auVar340._0_12_;
              auVar349._12_2_ = auVar340._6_2_;
              auVar349._14_2_ = *(undefined2 *)((long)auStack_118 + lVar56 + 6);
              auVar348._12_4_ = auVar349._12_4_;
              auVar348._0_10_ = auVar340._0_10_;
              auVar348._10_2_ = *(undefined2 *)((long)auStack_118 + lVar56 + 4);
              auVar347._10_6_ = auVar348._10_6_;
              auVar347._0_8_ = auVar340._0_8_;
              auVar347._8_2_ = auVar340._4_2_;
              auVar346._8_8_ = auVar347._8_8_;
              auVar346._6_2_ = *(undefined2 *)((long)auStack_118 + lVar56 + 2);
              auVar346._4_2_ = auVar340._2_2_;
              auVar346._0_2_ = auVar340._0_2_;
              auVar346._2_2_ = *(undefined2 *)((long)auStack_118 + lVar56);
              auVar318 = *(undefined1 (*) [16])(auStack_108 + lVar56);
              in_XMM5 = *(undefined1 (*) [16])((long)auStack_f8 + lVar56);
              auVar194 = pmaddwd(auVar190,auVar323);
              auVar290 = pmaddwd(auVar286,auVar314);
              auVar198._0_12_ = auVar318._0_12_;
              auVar198._12_2_ = auVar318._6_2_;
              auVar198._14_2_ = in_XMM5._6_2_;
              auVar197._12_4_ = auVar198._12_4_;
              auVar197._0_10_ = auVar318._0_10_;
              auVar197._10_2_ = in_XMM5._4_2_;
              auVar196._10_6_ = auVar197._10_6_;
              auVar196._0_8_ = auVar318._0_8_;
              auVar196._8_2_ = auVar318._4_2_;
              auVar195._8_8_ = auVar196._8_8_;
              auVar195._6_2_ = in_XMM5._2_2_;
              auVar195._4_2_ = auVar318._2_2_;
              auVar195._0_2_ = auVar318._0_2_;
              auVar195._2_2_ = in_XMM5._0_2_;
              auVar350 = pmaddwd(auVar346,auVar311);
              auVar199 = pmaddwd(auVar195,in_XMM4);
              iVar58 = auVar199._8_4_ + auVar350._8_4_ + auVar290._8_4_ + auVar194._8_4_;
              iVar235 = auVar199._12_4_ + auVar350._12_4_ + auVar290._12_4_ + auVar194._12_4_;
              auVar332._2_2_ = *(undefined2 *)((long)auStack_158 + lVar56 + 8);
              auVar332._0_2_ = auVar78._8_2_;
              auVar332._4_2_ = auVar78._10_2_;
              auVar332._6_2_ = *(undefined2 *)((long)auStack_158 + lVar56 + 10);
              auVar332._8_2_ = auVar78._12_2_;
              auVar332._10_2_ = *(undefined2 *)((long)auStack_158 + lVar56 + 0xc);
              auVar332._12_2_ = auVar78._14_2_;
              auVar332._14_2_ = *(undefined2 *)(auStack_148 + lVar56 + -2);
              auVar85._2_2_ = auVar333._8_2_;
              auVar85._0_2_ = auVar301._8_2_;
              auVar85._4_2_ = auVar301._10_2_;
              auVar85._6_2_ = auVar333._10_2_;
              auVar85._8_2_ = auVar301._12_2_;
              auVar85._10_2_ = auVar333._12_2_;
              auVar85._12_2_ = auVar301._14_2_;
              auVar85._14_2_ = auVar333._14_2_;
              auVar300._2_2_ = *(undefined2 *)((long)auStack_118 + lVar56 + 8);
              auVar300._0_2_ = auVar340._8_2_;
              auVar300._4_2_ = auVar340._10_2_;
              auVar300._6_2_ = *(undefined2 *)((long)auStack_118 + lVar56 + 10);
              auVar300._8_2_ = auVar340._12_2_;
              auVar300._10_2_ = *(undefined2 *)((long)auStack_118 + lVar56 + 0xc);
              auVar300._12_2_ = auVar340._14_2_;
              auVar300._14_2_ = *(undefined2 *)(auStack_108 + lVar56 + -2);
              auVar339._2_2_ = in_XMM5._8_2_;
              auVar339._0_2_ = auVar318._8_2_;
              auVar339._4_2_ = auVar318._10_2_;
              auVar339._6_2_ = in_XMM5._10_2_;
              auVar339._8_2_ = auVar318._12_2_;
              auVar339._10_2_ = in_XMM5._12_2_;
              auVar339._12_2_ = auVar318._14_2_;
              auVar339._14_2_ = in_XMM5._14_2_;
              auVar333 = pmaddwd(auVar332,auVar323);
              auVar78 = pmaddwd(auVar85,auVar314);
              auVar301 = pmaddwd(auVar300,auVar311);
              auVar340 = pmaddwd(auVar339,in_XMM4);
              iVar344 = auVar340._8_4_ + auVar301._8_4_ + auVar78._8_4_ + auVar333._8_4_;
              iVar345 = auVar340._12_4_ + auVar301._12_4_ + auVar78._12_4_ + auVar333._12_4_;
              in_XMM3._4_4_ = iVar344;
              in_XMM3._0_4_ = iVar58;
              in_XMM3._8_4_ = iVar235;
              in_XMM3._12_4_ = iVar345;
              auVar86._0_4_ =
                   auVar199._0_4_ + auVar350._0_4_ + auVar290._0_4_ + auVar194._0_4_ + iVar53 >>
                   auVar84;
              auVar86._4_4_ =
                   auVar340._0_4_ + auVar301._0_4_ + auVar78._0_4_ + auVar333._0_4_ + iVar53 >>
                   auVar84;
              auVar86._8_4_ =
                   auVar199._4_4_ + auVar350._4_4_ + auVar290._4_4_ + auVar194._4_4_ + iVar53 >>
                   auVar84;
              auVar86._12_4_ =
                   auVar340._4_4_ + auVar301._4_4_ + auVar78._4_4_ + auVar333._4_4_ + iVar53 >>
                   auVar84;
              if (conv_params->is_compound == 0) {
                auVar87._4_4_ = auVar86._4_4_;
                auVar87._0_4_ = auVar86._0_4_;
                auVar87._8_4_ = auVar86._8_4_;
                auVar87._12_4_ = auVar86._12_4_;
                in_XMM3._0_4_ = iVar58 + iVar53 >> auVar84;
                in_XMM3._4_4_ = iVar344 + iVar53 >> auVar84;
                in_XMM3._8_4_ = iVar235 + iVar53 >> auVar84;
                in_XMM3._12_4_ = iVar345 + iVar53 >> auVar84;
                auVar301 = packssdw(auVar87,in_XMM3);
                sVar147 = auVar301._0_2_;
                sVar151 = auVar301._2_2_;
                sVar152 = auVar301._4_2_;
                sVar153 = auVar301._6_2_;
                uVar75 = CONCAT13((0 < sVar153) * (sVar153 < 0x100) * auVar301[6] - (0xff < sVar153)
                                  ,CONCAT12((0 < sVar152) * (sVar152 < 0x100) * auVar301[4] -
                                            (0xff < sVar152),
                                            CONCAT11((0 < sVar151) * (sVar151 < 0x100) * auVar301[2]
                                                     - (0xff < sVar151),
                                                     (0 < sVar147) * (sVar147 < 0x100) * auVar301[0]
                                                     - (0xff < sVar147))));
                sVar154 = auVar301._8_2_;
                sVar155 = auVar301._10_2_;
                sVar156 = auVar301._12_2_;
                sVar157 = auVar301._14_2_;
                auVar78._0_8_ =
                     CONCAT17((0 < sVar157) * (sVar157 < 0x100) * auVar301[0xe] - (0xff < sVar157),
                              CONCAT16((0 < sVar156) * (sVar156 < 0x100) * auVar301[0xc] -
                                       (0xff < sVar156),
                                       CONCAT15((0 < sVar155) * (sVar155 < 0x100) * auVar301[10] -
                                                (0xff < sVar155),
                                                CONCAT14((0 < sVar154) * (sVar154 < 0x100) *
                                                         auVar301[8] - (0xff < sVar154),uVar75))));
                auVar78[8] = (0 < sVar147) * (sVar147 < 0x100) * auVar301[0] - (0xff < sVar147);
                auVar78[9] = (0 < sVar151) * (sVar151 < 0x100) * auVar301[2] - (0xff < sVar151);
                auVar78[10] = (0 < sVar152) * (sVar152 < 0x100) * auVar301[4] - (0xff < sVar152);
                auVar78[0xb] = (0 < sVar153) * (sVar153 < 0x100) * auVar301[6] - (0xff < sVar153);
                auVar78[0xc] = (0 < sVar154) * (sVar154 < 0x100) * auVar301[8] - (0xff < sVar154);
                auVar78[0xd] = (0 < sVar155) * (sVar155 < 0x100) * auVar301[10] - (0xff < sVar155);
                auVar78[0xe] = (0 < sVar156) * (sVar156 < 0x100) * auVar301[0xc] - (0xff < sVar156);
                auVar78[0xf] = (0 < sVar157) * (sVar157 < 0x100) * auVar301[0xe] - (0xff < sVar157);
                if (p_width == 4) {
                  *(undefined4 *)(pred + iVar71) = uVar75;
                }
                else {
                  *(undefined8 *)(pred + iVar71) = auVar78._0_8_;
                }
              }
              else {
                iVar59 = conv_params->dst_stride * iVar46 + iVar65;
                auVar78 = packusdw(auVar86,auVar86);
                if (conv_params->do_average == 0) {
                  *(long *)(conv_params->dst + iVar59) = auVar78._0_8_;
                }
                else {
                  uVar5 = *(ulong *)(conv_params->dst + iVar59);
                  sVar152 = (short)(uVar5 >> 0x30);
                  sVar151 = (short)(uVar5 >> 0x20);
                  auVar163._0_2_ = (short)uVar5;
                  sVar147 = (short)(uVar5 >> 0x10);
                  if (conv_params->use_dist_wtd_comp_avg == 0) {
                    auVar88._0_2_ = auVar78._0_2_ + auVar163._0_2_;
                    auVar88._2_2_ = auVar78._2_2_ + sVar147;
                    auVar88._4_2_ = auVar78._4_2_ + sVar151;
                    auVar88._6_2_ = auVar78._6_2_ + sVar152;
                    auVar88._8_2_ = auVar78._8_2_;
                    auVar88._10_2_ = auVar78._10_2_;
                    auVar88._12_2_ = auVar78._12_2_;
                    auVar88._14_2_ = auVar78._14_2_;
                    auVar78 = psraw(auVar88,1);
                    auVar301 = auVar78;
                  }
                  else {
                    auVar166._8_4_ = 0;
                    auVar166._0_8_ = uVar5;
                    auVar166._12_2_ = sVar152;
                    auVar166._14_2_ = auVar78._6_2_;
                    auVar165._12_4_ = auVar166._12_4_;
                    auVar165._8_2_ = 0;
                    auVar165._0_8_ = uVar5;
                    auVar165._10_2_ = auVar78._4_2_;
                    auVar164._10_6_ = auVar165._10_6_;
                    auVar164._8_2_ = sVar151;
                    auVar164._0_8_ = uVar5;
                    auVar163._8_8_ = auVar164._8_8_;
                    auVar163._6_2_ = auVar78._2_2_;
                    auVar163._4_2_ = sVar147;
                    auVar163._2_2_ = auVar78._0_2_;
                    auVar16._4_4_ = uVar74;
                    auVar16._0_4_ = uVar74;
                    auVar16._8_4_ = uVar74;
                    auVar16._12_4_ = uVar74;
                    auVar301 = pmaddwd(auVar163,auVar16);
                    auVar167._0_4_ = auVar301._0_4_ >> 4;
                    auVar167._4_4_ = auVar301._4_4_ >> 4;
                    auVar167._8_4_ = auVar301._8_4_ >> 4;
                    auVar167._12_4_ = auVar301._12_4_ >> 4;
                    auVar301 = packusdw(auVar167,auVar167);
                  }
                  auVar168._0_2_ = auVar301._0_2_ + local_2e8;
                  auVar168._2_2_ = auVar301._2_2_ + sStack_2e6;
                  auVar168._4_2_ = auVar301._4_2_ + local_2e8;
                  auVar168._6_2_ = auVar301._6_2_ + sStack_2e6;
                  auVar168._8_2_ = auVar301._8_2_ + local_2e8;
                  auVar168._10_2_ = auVar301._10_2_ + sStack_2e6;
                  auVar168._12_2_ = auVar301._12_2_ + local_2e8;
                  auVar168._14_2_ = auVar301._14_2_ + sStack_2e6;
                  auVar301 = psraw(auVar168,auVar322);
                  sVar147 = auVar301._0_2_;
                  sVar151 = auVar301._2_2_;
                  sVar152 = auVar301._4_2_;
                  sVar153 = auVar301._6_2_;
                  *(uint *)(pred + iVar71) =
                       CONCAT13((0 < sVar153) * (sVar153 < 0x100) * auVar301[6] - (0xff < sVar153),
                                CONCAT12((0 < sVar152) * (sVar152 < 0x100) * auVar301[4] -
                                         (0xff < sVar152),
                                         CONCAT11((0 < sVar151) * (sVar151 < 0x100) * auVar301[2] -
                                                  (0xff < sVar151),
                                                  (0 < sVar147) * (sVar147 < 0x100) * auVar301[0] -
                                                  (0xff < sVar147))));
                }
                if (4 < p_width) {
                  auVar200._0_4_ = iVar58 + iVar53 >> auVar84;
                  auVar200._4_4_ = iVar344 + iVar53 >> auVar84;
                  auVar200._8_4_ = iVar235 + iVar53 >> auVar84;
                  auVar200._12_4_ = iVar345 + iVar53 >> auVar84;
                  lVar72 = (long)(conv_params->dst_stride * iVar46 + iVar65);
                  in_XMM3 = packusdw(auVar200,auVar200);
                  if (conv_params->do_average == 0) {
                    *(long *)(conv_params->dst + lVar72 + 4) = in_XMM3._0_8_;
                  }
                  else {
                    uVar5 = *(ulong *)(conv_params->dst + lVar72 + 4);
                    sVar152 = (short)(uVar5 >> 0x30);
                    sVar151 = (short)(uVar5 >> 0x20);
                    auVar89._0_2_ = (short)uVar5;
                    sVar147 = (short)(uVar5 >> 0x10);
                    if (conv_params->use_dist_wtd_comp_avg == 0) {
                      auVar201._0_2_ = in_XMM3._0_2_ + auVar89._0_2_;
                      auVar201._2_2_ = in_XMM3._2_2_ + sVar147;
                      auVar201._4_2_ = in_XMM3._4_2_ + sVar151;
                      auVar201._6_2_ = in_XMM3._6_2_ + sVar152;
                      auVar201._8_2_ = in_XMM3._8_2_;
                      auVar201._10_2_ = in_XMM3._10_2_;
                      auVar201._12_2_ = in_XMM3._12_2_;
                      auVar201._14_2_ = in_XMM3._14_2_;
                      auVar78 = psraw(auVar201,1);
                      in_XMM3 = auVar78;
                    }
                    else {
                      auVar92._8_4_ = 0;
                      auVar92._0_8_ = uVar5;
                      auVar92._12_2_ = sVar152;
                      auVar92._14_2_ = in_XMM3._6_2_;
                      auVar91._12_4_ = auVar92._12_4_;
                      auVar91._8_2_ = 0;
                      auVar91._0_8_ = uVar5;
                      auVar91._10_2_ = in_XMM3._4_2_;
                      auVar90._10_6_ = auVar91._10_6_;
                      auVar90._8_2_ = sVar151;
                      auVar90._0_8_ = uVar5;
                      auVar89._8_8_ = auVar90._8_8_;
                      auVar89._6_2_ = in_XMM3._2_2_;
                      auVar89._4_2_ = sVar147;
                      auVar89._2_2_ = in_XMM3._0_2_;
                      auVar17._4_4_ = uVar74;
                      auVar17._0_4_ = uVar74;
                      auVar17._8_4_ = uVar74;
                      auVar17._12_4_ = uVar74;
                      auVar78 = pmaddwd(auVar89,auVar17);
                      auVar93._0_4_ = auVar78._0_4_ >> 4;
                      auVar93._4_4_ = auVar78._4_4_ >> 4;
                      auVar93._8_4_ = auVar78._8_4_ >> 4;
                      auVar93._12_4_ = auVar78._12_4_ >> 4;
                      auVar78 = packusdw(auVar93,auVar93);
                    }
                    auVar94._0_2_ = auVar78._0_2_ + local_2e8;
                    auVar94._2_2_ = auVar78._2_2_ + sStack_2e6;
                    auVar94._4_2_ = auVar78._4_2_ + local_2e8;
                    auVar94._6_2_ = auVar78._6_2_ + sStack_2e6;
                    auVar94._8_2_ = auVar78._8_2_ + local_2e8;
                    auVar94._10_2_ = auVar78._10_2_ + sStack_2e6;
                    auVar94._12_2_ = auVar78._12_2_ + local_2e8;
                    auVar94._14_2_ = auVar78._14_2_ + sStack_2e6;
                    auVar301 = psraw(auVar94,auVar322);
                    sVar147 = auVar301._0_2_;
                    sVar151 = auVar301._2_2_;
                    sVar152 = auVar301._4_2_;
                    sVar153 = auVar301._6_2_;
                    auVar78._0_4_ =
                         CONCAT13((0 < sVar153) * (sVar153 < 0x100) * auVar301[6] - (0xff < sVar153)
                                  ,CONCAT12((0 < sVar152) * (sVar152 < 0x100) * auVar301[4] -
                                            (0xff < sVar152),
                                            CONCAT11((0 < sVar151) * (sVar151 < 0x100) * auVar301[2]
                                                     - (0xff < sVar151),
                                                     (0 < sVar147) * (sVar147 < 0x100) * auVar301[0]
                                                     - (0xff < sVar147))));
                    sVar154 = auVar301._8_2_;
                    auVar78[4] = (0 < sVar154) * (sVar154 < 0x100) * auVar301[8] - (0xff < sVar154);
                    sVar155 = auVar301._10_2_;
                    auVar78[5] = (0 < sVar155) * (sVar155 < 0x100) * auVar301[10] - (0xff < sVar155)
                    ;
                    sVar156 = auVar301._12_2_;
                    auVar78[6] = (0 < sVar156) * (sVar156 < 0x100) * auVar301[0xc] -
                                 (0xff < sVar156);
                    sVar157 = auVar301._14_2_;
                    auVar78[7] = (0 < sVar157) * (sVar157 < 0x100) * auVar301[0xe] -
                                 (0xff < sVar157);
                    auVar78[8] = (0 < sVar147) * (sVar147 < 0x100) * auVar301[0] - (0xff < sVar147);
                    auVar78[9] = (0 < sVar151) * (sVar151 < 0x100) * auVar301[2] - (0xff < sVar151);
                    auVar78[10] = (0 < sVar152) * (sVar152 < 0x100) * auVar301[4] - (0xff < sVar152)
                    ;
                    auVar78[0xb] = (0 < sVar153) * (sVar153 < 0x100) * auVar301[6] -
                                   (0xff < sVar153);
                    auVar78[0xc] = (0 < sVar154) * (sVar154 < 0x100) * auVar301[8] -
                                   (0xff < sVar154);
                    auVar78[0xd] = (0 < sVar155) * (sVar155 < 0x100) * auVar301[10] -
                                   (0xff < sVar155);
                    auVar78[0xe] = (0 < sVar156) * (sVar156 < 0x100) * auVar301[0xc] -
                                   (0xff < sVar156);
                    auVar78[0xf] = (0 < sVar157) * (sVar157 < 0x100) * auVar301[0xe] -
                                   (0xff < sVar157);
                    *(undefined4 *)(pred + (long)iVar71 + 4) = auVar78._0_4_;
                  }
                }
              }
              iVar71 = iVar71 + p_stride;
              lVar56 = lVar56 + 0x10;
              iVar46 = iVar46 + 1;
              iVar67 = iVar67 + iVar40;
            } while (lVar9 != lVar56);
          }
          iVar65 = iVar65 + 8;
          local_318 = local_318 + 8;
          auVar84 = local_78;
          auVar322 = local_68;
          auVar301 = _DAT_00562b70;
          auVar333 = _DAT_00562b80;
        } while (iVar65 < p_width);
      }
      iVar49 = iVar49 + 8;
      uVar47 = uVar47 - 8;
      local_2fc = local_2fc + p_stride * 8;
    } while (iVar49 < p_height);
  }
  return;
}

Assistant:

void av1_warp_affine_sse4_1(const int32_t *mat, const uint8_t *ref, int width,
                            int height, int stride, uint8_t *pred, int p_col,
                            int p_row, int p_width, int p_height, int p_stride,
                            int subsampling_x, int subsampling_y,
                            ConvolveParams *conv_params, int16_t alpha,
                            int16_t beta, int16_t gamma, int16_t delta) {
  __m128i tmp[15];
  int i, j, k;
  const int bd = 8;
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));

  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const __m128i reduce_bits_vert_const =
      _mm_set1_epi32(((1 << reduce_bits_vert) >> 1));
  const __m128i res_add_const = _mm_set1_epi32(1 << offset_bits_vert);
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  assert(IMPLIES(conv_params->do_average, conv_params->is_compound));

  /* Note: For this code to work, the left/right frame borders need to be
  extended by at least 13 pixels each. By the time we get here, other
  code will have set up this border, but we allow an explicit check
  for debugging purposes.
  */
  /*for (i = 0; i < height; ++i) {
  for (j = 0; j < 13; ++j) {
  assert(ref[i * stride - 13 + j] == ref[i * stride]);
  assert(ref[i * stride + width + j] == ref[i * stride + (width - 1)]);
  }
  }*/
  __m128i res_add_const_1;
  if (conv_params->is_compound == 1) {
    res_add_const_1 = _mm_add_epi32(reduce_bits_vert_const, res_add_const);
  } else {
    res_add_const_1 = _mm_set1_epi32(-(1 << (bd + reduce_bits_vert - 1)) +
                                     ((1 << reduce_bits_vert) >> 1));
  }

  for (i = 0; i < p_height; i += 8) {
    for (j = 0; j < p_width; j += 8) {
      const int32_t src_x = (p_col + j + 4) << subsampling_x;
      const int32_t src_y = (p_row + i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      int32_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      int32_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      // Add in all the constant terms, including rounding and offset
      sx4 += alpha * (-4) + beta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
      sy4 += gamma * (-4) + delta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);

      sx4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);
      sy4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);

      // Horizontal filter
      // If the block is aligned such that, after clamping, every sample
      // would be taken from the leftmost/rightmost column, then we can
      // skip the expensive horizontal filter.
      if (ix4 <= -7) {
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] = _mm_set1_epi16(
              (1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
              ref[iy * stride] * (1 << (FILTER_BITS - reduce_bits_horiz)));
        }
      } else if (ix4 >= width + 6) {
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] =
              _mm_set1_epi16((1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
                             ref[iy * stride + (width - 1)] *
                                 (1 << (FILTER_BITS - reduce_bits_horiz)));
        }
      } else if (((ix4 - 7) < 0) || ((ix4 + 9) > width)) {
        const int out_of_boundary_left = -(ix4 - 6);
        const int out_of_boundary_right = (ix4 + 8) - width;
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          int sx = sx4 + beta * (k + 4);

          // Load source pixels
          __m128i src =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
          if (out_of_boundary_left >= 0) {
            const __m128i shuffle_reg_left =
                _mm_loadu_si128((__m128i *)warp_pad_left[out_of_boundary_left]);
            src = _mm_shuffle_epi8(src, shuffle_reg_left);
          }
          if (out_of_boundary_right >= 0) {
            const __m128i shuffle_reg_right = _mm_loadu_si128(
                (__m128i *)warp_pad_right[out_of_boundary_right]);
            src = _mm_shuffle_epi8(src, shuffle_reg_right);
          }
          horizontal_filter(src, tmp, sx, alpha, k, offset_bits_horiz,
                            reduce_bits_horiz);
        }
      } else {
        prepare_warp_horizontal_filter(ref, tmp, stride, ix4, iy4, sx4, alpha,
                                       beta, p_height, height, i,
                                       offset_bits_horiz, reduce_bits_horiz);
      }

      // Vertical filter
      prepare_warp_vertical_filter(
          pred, tmp, conv_params, gamma, delta, p_height, p_stride, p_width, i,
          j, sy4, reduce_bits_vert, &res_add_const_1, round_bits, offset_bits);
    }
  }
}